

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O2

void av1_resize_and_extend_frame_ssse3
               (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,InterpFilter filter,int phase,
               int num_planes)

{
  uint8_t *puVar1;
  ushort *puVar2;
  longlong *plVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  ushort *puVar8;
  ushort *puVar9;
  ushort *puVar10;
  __m128i *palVar11;
  int16_t *piVar12;
  code *pcVar13;
  char cVar14;
  byte bVar15;
  byte bVar23;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  longlong *plVar83;
  longlong *plVar84;
  _Bool _Var85;
  uint uVar86;
  long lVar87;
  uint uVar88;
  InterpFilterParams *pIVar89;
  ulong uVar90;
  uint8_t *puVar91;
  uint8_t *puVar92;
  uint uVar93;
  int iVar94;
  ulong uVar95;
  char *pcVar96;
  ulong uVar97;
  long lVar98;
  ulong uVar99;
  longlong *dst_00;
  long lVar100;
  int iVar101;
  int iVar102;
  uint uVar103;
  ulong uVar104;
  int iVar105;
  uint uVar106;
  uint8_t *puVar107;
  long lVar108;
  uint uVar109;
  int iVar110;
  uint uVar111;
  int iVar112;
  longlong *plVar113;
  longlong *plVar114;
  int iVar115;
  ulong uVar116;
  int iVar117;
  bool bVar118;
  undefined2 uVar119;
  ushort uVar120;
  short extraout_XMM0_Wa;
  short extraout_XMM0_Wa_00;
  ushort uVar121;
  short extraout_XMM0_Wa_01;
  short extraout_XMM0_Wa_02;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  ushort uVar148;
  undefined8 extraout_XMM0_Qa_11;
  short extraout_XMM0_Wb_01;
  short extraout_XMM0_Wc_01;
  short extraout_XMM0_Wd_01;
  undefined8 extraout_XMM0_Qa_12;
  ushort uVar146;
  short extraout_XMM0_Wb_02;
  ushort uVar147;
  short extraout_XMM0_Wc_02;
  short extraout_XMM0_Wd_02;
  ushort uVar150;
  ushort uVar151;
  short extraout_XMM0_We_01;
  short extraout_XMM0_We_02;
  ushort uVar152;
  short extraout_XMM0_Wf_02;
  ushort uVar153;
  short extraout_XMM0_Wg_02;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar131 [16];
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  ushort uVar149;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  short extraout_XMM0_Wb;
  short extraout_XMM0_Wc;
  short extraout_XMM0_Wd;
  short extraout_XMM0_We;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  ushort uVar155;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  short extraout_XMM0_Wf;
  short extraout_XMM0_Wg;
  short extraout_XMM0_Wh;
  undefined1 auVar137 [16];
  short extraout_XMM0_Wb_00;
  short extraout_XMM0_Wc_00;
  short extraout_XMM0_Wd_00;
  short extraout_XMM0_We_00;
  undefined8 extraout_XMM0_Qb_14;
  undefined8 extraout_XMM0_Qb_15;
  undefined8 extraout_XMM0_Qb_16;
  short extraout_XMM0_Wf_00;
  short extraout_XMM0_Wg_00;
  short extraout_XMM0_Wh_00;
  undefined1 auVar142 [16];
  ushort uVar154;
  undefined8 extraout_XMM0_Qb_17;
  short extraout_XMM0_Wf_01;
  short extraout_XMM0_Wg_01;
  short extraout_XMM0_Wh_01;
  undefined8 extraout_XMM0_Qb_18;
  short extraout_XMM0_Wh_02;
  undefined2 uVar156;
  ushort uVar157;
  ushort uVar180;
  undefined1 auVar161 [12];
  ushort uVar176;
  ushort uVar177;
  ushort uVar178;
  ushort uVar179;
  ushort uVar181;
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  ushort uVar182;
  undefined1 auVar171 [16];
  undefined2 uVar183;
  undefined1 auVar188 [12];
  undefined1 auVar189 [12];
  undefined1 auVar190 [12];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined2 uVar202;
  ushort uVar203;
  ushort uVar212;
  ushort uVar213;
  ushort uVar214;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar216 [16];
  undefined4 uVar217;
  undefined4 uVar221;
  undefined1 auVar226 [16];
  undefined4 uVar227;
  undefined4 uVar231;
  __m128i alVar235;
  uint8_t *local_398;
  uint local_390;
  undefined8 local_388;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  longlong *local_370;
  undefined8 local_358;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  uint8_t *local_338;
  uint8_t *local_330;
  undefined8 local_328;
  short sStack_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  undefined8 local_2f8;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  undefined8 local_2d8;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  __m128i s [11];
  __m128i f1 [5];
  __m128i local_c8;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  char acStack_78 [72];
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  undefined4 uVar122;
  undefined1 auVar132 [16];
  undefined6 uVar123;
  undefined1 auVar133 [16];
  undefined1 auVar138 [16];
  undefined1 auVar134 [16];
  undefined1 auVar139 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar135 [16];
  undefined1 auVar140 [16];
  undefined1 auVar136 [16];
  undefined1 auVar141 [16];
  undefined1 auVar165 [16];
  undefined4 uVar158;
  undefined6 uVar159;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar160 [12];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar162 [14];
  undefined1 auVar163 [14];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar195 [16];
  undefined4 uVar184;
  undefined6 uVar185;
  undefined8 uVar186;
  undefined1 auVar187 [12];
  undefined1 auVar191 [14];
  undefined1 auVar199 [16];
  undefined1 auVar192 [14];
  undefined1 auVar201 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined4 uVar204;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  
  _Var85 = has_normative_scaler_ssse3
                     ((src->field_2).field_0.y_crop_width,(src->field_3).field_0.y_crop_height,
                      (dst->field_2).field_0.y_crop_width,(dst->field_3).field_0.y_crop_height);
  if (1 < num_planes) {
    if (!_Var85) goto LAB_0036eec1;
    _Var85 = has_normative_scaler_ssse3
                       ((src->field_2).field_0.uv_crop_width,(src->field_3).field_0.uv_crop_height,
                        (dst->field_2).field_0.uv_crop_width,(dst->field_3).field_0.uv_crop_height);
  }
  if (_Var85 != false) {
    uVar111 = 3;
    if (num_planes < 3) {
      uVar111 = num_planes;
    }
    pIVar89 = av1_interp_filter_params_list + filter;
    uVar88 = phase + 0x15;
    uVar86 = phase + 0x2a;
    uVar93 = uVar88 >> 4 & 1;
    uVar109 = uVar86 >> 4 & 1;
    uVar4 = uVar93 * 8;
    uVar95 = (ulong)(uVar93 << 4);
    pcVar96 = (char *)((long)f1[1] + uVar95);
    uVar97 = (ulong)(uVar109 << 4);
    lVar98 = (long)phase;
    if ((int)uVar111 < 1) {
      uVar111 = 0;
    }
    uVar116 = 0;
    auVar145 = _DAT_0046b270;
    do {
      if (uVar116 == uVar111) {
        aom_extend_frame_borders_c(dst,num_planes);
        return;
      }
      bVar118 = uVar116 != 0;
      lVar87 = (ulong)bVar118 * 4;
      iVar112 = *(int *)((long)src->store_buf_adr + lVar87 + -0x38);
      iVar117 = *(int *)((long)src->store_buf_adr + lVar87 + -0x30);
      iVar105 = *(int *)((long)dst->store_buf_adr + lVar87 + -0x38);
      iVar110 = *(int *)((long)dst->store_buf_adr + lVar87 + -0x30);
      uVar104 = (long)(dst->field_2).field_0.y_crop_width + 1U & 0xfffffffffffffffe;
      uVar99 = (long)(dst->field_3).field_0.y_crop_height + 1;
      uVar90 = uVar99 & 0xfffffffffffffffe;
      if ((iVar105 * 2 == iVar112) && (iVar110 * 2 == iVar117)) {
        if (phase == 0) {
          puVar91 = src->store_buf_adr[uVar116 - 4];
          iVar112 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
          puVar92 = dst->store_buf_adr[uVar116 - 4];
          iVar117 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
          uVar93 = iVar105 + 0xfU & 0xfffffff0;
          do {
            lVar108 = 0;
            lVar87 = (long)(int)uVar93 * 2 + (long)iVar112 * -2;
            do {
              puVar2 = (ushort *)(puVar91 + lVar108 * 2);
              uVar76 = puVar2[1];
              uVar77 = puVar2[2];
              uVar78 = puVar2[3];
              uVar79 = puVar2[4];
              uVar80 = puVar2[5];
              uVar81 = puVar2[6];
              uVar82 = puVar2[7];
              puVar8 = (ushort *)(puVar91 + lVar108 * 2 + 0x10);
              uVar121 = *puVar8;
              uVar148 = puVar8[1];
              uVar151 = puVar8[2];
              uVar154 = puVar8[3];
              uVar203 = puVar8[4];
              uVar212 = puVar8[5];
              uVar213 = puVar8[6];
              uVar214 = puVar8[7];
              uVar120 = *puVar2 & 0xff;
              uVar146 = uVar76 & 0xff;
              uVar147 = uVar77 & 0xff;
              uVar149 = uVar78 & 0xff;
              uVar150 = uVar79 & 0xff;
              uVar152 = uVar80 & 0xff;
              uVar153 = uVar81 & 0xff;
              uVar155 = uVar82 & 0xff;
              uVar157 = uVar121 & 0xff;
              uVar176 = uVar148 & 0xff;
              uVar177 = uVar151 & 0xff;
              uVar178 = uVar154 & 0xff;
              uVar179 = uVar203 & 0xff;
              uVar180 = uVar212 & 0xff;
              uVar181 = uVar213 & 0xff;
              uVar182 = uVar214 & 0xff;
              puVar107 = puVar92 + lVar108;
              *puVar107 = (uVar120 != 0) * (uVar120 < 0x100) * (char)*puVar2 - (0xff < uVar120);
              puVar107[1] = (uVar146 != 0) * (uVar146 < 0x100) * (char)uVar76 - (0xff < uVar146);
              puVar107[2] = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar77 - (0xff < uVar147);
              puVar107[3] = (uVar149 != 0) * (uVar149 < 0x100) * (char)uVar78 - (0xff < uVar149);
              puVar107[4] = (uVar150 != 0) * (uVar150 < 0x100) * (char)uVar79 - (0xff < uVar150);
              puVar107[5] = (uVar152 != 0) * (uVar152 < 0x100) * (char)uVar80 - (0xff < uVar152);
              puVar107[6] = (uVar153 != 0) * (uVar153 < 0x100) * (char)uVar81 - (0xff < uVar153);
              puVar107[7] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar82 - (0xff < uVar155);
              puVar107[8] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar121 - (0xff < uVar157);
              puVar107[9] = (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar148 - (0xff < uVar176);
              puVar107[10] = (uVar177 != 0) * (uVar177 < 0x100) * (char)uVar151 - (0xff < uVar177);
              puVar107[0xb] = (uVar178 != 0) * (uVar178 < 0x100) * (char)uVar154 - (0xff < uVar178);
              puVar107[0xc] = (uVar179 != 0) * (uVar179 < 0x100) * (char)uVar203 - (0xff < uVar179);
              puVar107[0xd] = (uVar180 != 0) * (uVar180 < 0x100) * (char)uVar212 - (0xff < uVar180);
              puVar107[0xe] = (uVar181 != 0) * (uVar181 < 0x100) * (char)uVar213 - (0xff < uVar181);
              puVar107[0xf] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar214 - (0xff < uVar182);
              lVar108 = lVar108 + 0x10;
              lVar87 = lVar87 + -0x20;
            } while (uVar93 != (uint)lVar108);
            puVar91 = puVar91 + -lVar87;
            puVar92 = puVar92 + lVar108 + ((long)iVar117 - (long)(int)uVar93);
            iVar110 = iVar110 + -1;
          } while (iVar110 != 0);
        }
        else {
          if (filter != BILINEAR) {
            local_370 = (longlong *)
                        malloc((uVar90 * 2 + 0xd & 0x3ffffffffffffff8) *
                               (uVar104 + 3 & 0xfffffffffffffffc));
            if (local_370 == (longlong *)0x0) goto LAB_0036eef8;
            iVar112 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            puVar91 = dst->store_buf_adr[uVar116 - 4];
            iVar102 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            lVar108 = (long)iVar102;
            uVar106 = iVar105 + 3U & 0xfffffffc;
            uVar93 = iVar117 + 0xdU & 0xfffffff8;
            local_388 = (longlong *)(src->store_buf_adr[uVar116 - 4] + (iVar112 * -3 + -5));
            auVar145 = *(undefined1 (*) [16])(pIVar89->filter_ptr + lVar98 * 8);
            f1[0] = (__m128i)pshufb(auVar145,_DAT_0046b2b0);
            f1[1] = (__m128i)pshufb(auVar145,_DAT_0046b2c0);
            f1[2] = (__m128i)pshufb(auVar145,_DAT_0046b2d0);
            f1[3] = (__m128i)pshufb(auVar145,_DAT_0046b2e0);
            lVar87 = (long)(int)(uVar106 * 2);
            plVar114 = local_370;
            do {
              load_8bit_8x8((uint8_t *)((long)local_388 + 2),(long)iVar112,s);
              transpose_16bit_4x8(s,s);
              lVar100 = 0;
              palVar11 = s + 3;
              iVar117 = -uVar106;
              do {
                load_8bit_8x8((uint8_t *)((long)local_388 + lVar100 + 8),(long)iVar112,palVar11);
                transpose_16bit_4x8(palVar11,palVar11);
                convolve8_8_ssse3(s,f1);
                convolve8_8_ssse3(s + 1,f1);
                convolve8_8_ssse3(s + 2,f1);
                convolve8_8_ssse3(palVar11,f1);
                local_308._0_2_ = (short)extraout_XMM0_Qa_03;
                local_308._2_2_ = (short)((ulong)extraout_XMM0_Qa_03 >> 0x10);
                local_308._4_2_ = (short)((ulong)extraout_XMM0_Qa_03 >> 0x20);
                local_308._6_2_ = (short)((ulong)extraout_XMM0_Qa_03 >> 0x30);
                sStack_300 = (short)extraout_XMM0_Qb_11;
                sStack_2fe = (short)((ulong)extraout_XMM0_Qb_11 >> 0x10);
                sStack_2fc = (short)((ulong)extraout_XMM0_Qb_11 >> 0x20);
                sStack_2fa = (short)((ulong)extraout_XMM0_Qb_11 >> 0x30);
                local_358._0_2_ = (short)extraout_XMM0_Qa_05;
                local_358._2_2_ = (short)((ulong)extraout_XMM0_Qa_05 >> 0x10);
                local_358._4_2_ = (short)((ulong)extraout_XMM0_Qa_05 >> 0x20);
                local_358._6_2_ = (short)((ulong)extraout_XMM0_Qa_05 >> 0x30);
                sStack_350 = (short)extraout_XMM0_Qb_13;
                sStack_34e = (short)((ulong)extraout_XMM0_Qb_13 >> 0x10);
                sStack_34c = (short)((ulong)extraout_XMM0_Qb_13 >> 0x20);
                sStack_34a = (short)((ulong)extraout_XMM0_Qb_13 >> 0x30);
                uVar156 = CONCAT11((0 < local_308._2_2_) * (local_308._2_2_ < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qa_03 >> 0x10) -
                                   (0xff < local_308._2_2_),
                                   (0 < (short)local_308) * ((short)local_308 < 0x100) *
                                   (char)extraout_XMM0_Qa_03 - (0xff < (short)local_308));
                uVar158 = CONCAT13((0 < local_308._6_2_) * (local_308._6_2_ < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qa_03 >> 0x30) -
                                   (0xff < local_308._6_2_),
                                   CONCAT12((0 < local_308._4_2_) * (local_308._4_2_ < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qa_03 >> 0x20) -
                                            (0xff < local_308._4_2_),uVar156));
                uVar159 = CONCAT15((0 < sStack_2fe) * (sStack_2fe < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb_11 >> 0x10) - (0xff < sStack_2fe),
                                   CONCAT14((0 < sStack_300) * (sStack_300 < 0x100) *
                                            (char)extraout_XMM0_Qb_11 - (0xff < sStack_300),uVar158)
                                  );
                uVar125 = CONCAT17((0 < sStack_2fa) * (sStack_2fa < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb_11 >> 0x30) - (0xff < sStack_2fa),
                                   CONCAT16((0 < sStack_2fc) * (sStack_2fc < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qb_11 >> 0x20) -
                                            (0xff < sStack_2fc),uVar159));
                auVar189._0_10_ =
                     CONCAT19((0 < local_358._2_2_) * (local_358._2_2_ < 0x100) *
                              (char)((ulong)extraout_XMM0_Qa_05 >> 0x10) - (0xff < local_358._2_2_),
                              CONCAT18((0 < (short)local_358) * ((short)local_358 < 0x100) *
                                       (char)extraout_XMM0_Qa_05 - (0xff < (short)local_358),uVar125
                                      ));
                auVar189[10] = (0 < local_358._4_2_) * (local_358._4_2_ < 0x100) *
                               (char)((ulong)extraout_XMM0_Qa_05 >> 0x20) - (0xff < local_358._4_2_)
                ;
                auVar189[0xb] =
                     (0 < local_358._6_2_) * (local_358._6_2_ < 0x100) *
                     (char)((ulong)extraout_XMM0_Qa_05 >> 0x30) - (0xff < local_358._6_2_);
                auVar192[0xc] =
                     (0 < sStack_350) * (sStack_350 < 0x100) * (char)extraout_XMM0_Qb_13 -
                     (0xff < sStack_350);
                auVar192._0_12_ = auVar189;
                auVar192[0xd] =
                     (0 < sStack_34e) * (sStack_34e < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_13 >> 0x10) - (0xff < sStack_34e);
                auVar200[0xe] =
                     (0 < sStack_34c) * (sStack_34c < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_13 >> 0x20) - (0xff < sStack_34c);
                auVar200._0_14_ = auVar192;
                auVar200[0xf] =
                     (0 < sStack_34a) * (sStack_34a < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_13 >> 0x30) - (0xff < sStack_34a);
                local_318._0_2_ = (short)extraout_XMM0_Qa_04;
                local_318._2_2_ = (short)((ulong)extraout_XMM0_Qa_04 >> 0x10);
                local_318._4_2_ = (short)((ulong)extraout_XMM0_Qa_04 >> 0x20);
                local_318._6_2_ = (short)((ulong)extraout_XMM0_Qa_04 >> 0x30);
                uStack_310._0_2_ = (short)extraout_XMM0_Qb_12;
                uStack_310._2_2_ = (short)((ulong)extraout_XMM0_Qb_12 >> 0x10);
                uStack_310._4_2_ = (short)((ulong)extraout_XMM0_Qb_12 >> 0x20);
                uStack_310._6_2_ = (short)((ulong)extraout_XMM0_Qb_12 >> 0x30);
                uVar119 = CONCAT11((0 < local_318._2_2_) * (local_318._2_2_ < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qa_04 >> 0x10) -
                                   (0xff < local_318._2_2_),
                                   (0 < (short)local_318) * ((short)local_318 < 0x100) *
                                   (char)extraout_XMM0_Qa_04 - (0xff < (short)local_318));
                uVar122 = CONCAT13((0 < local_318._6_2_) * (local_318._6_2_ < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qa_04 >> 0x30) -
                                   (0xff < local_318._6_2_),
                                   CONCAT12((0 < local_318._4_2_) * (local_318._4_2_ < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qa_04 >> 0x20) -
                                            (0xff < local_318._4_2_),uVar119));
                uVar123 = CONCAT15((0 < uStack_310._2_2_) * (uStack_310._2_2_ < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb_12 >> 0x10) -
                                   (0xff < uStack_310._2_2_),
                                   CONCAT14((0 < (short)uStack_310) * ((short)uStack_310 < 0x100) *
                                            (char)extraout_XMM0_Qb_12 - (0xff < (short)uStack_310),
                                            uVar122));
                uVar124 = CONCAT17((0 < uStack_310._6_2_) * (uStack_310._6_2_ < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb_12 >> 0x30) -
                                   (0xff < uStack_310._6_2_),
                                   CONCAT16((0 < uStack_310._4_2_) * (uStack_310._4_2_ < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qb_12 >> 0x20) -
                                            (0xff < uStack_310._4_2_),uVar123));
                auVar161._0_10_ =
                     CONCAT19((0 < extraout_XMM0_Wb) * (extraout_XMM0_Wb < 0x100) *
                              (char)extraout_XMM0_Wb - (0xff < extraout_XMM0_Wb),
                              CONCAT18((0 < extraout_XMM0_Wa) * (extraout_XMM0_Wa < 0x100) *
                                       (char)extraout_XMM0_Wa - (0xff < extraout_XMM0_Wa),uVar124));
                auVar161[10] = (0 < extraout_XMM0_Wc) * (extraout_XMM0_Wc < 0x100) *
                               (char)extraout_XMM0_Wc - (0xff < extraout_XMM0_Wc);
                auVar161[0xb] =
                     (0 < extraout_XMM0_Wd) * (extraout_XMM0_Wd < 0x100) * (char)extraout_XMM0_Wd -
                     (0xff < extraout_XMM0_Wd);
                auVar163[0xc] =
                     (0 < extraout_XMM0_We) * (extraout_XMM0_We < 0x100) * (char)extraout_XMM0_We -
                     (0xff < extraout_XMM0_We);
                auVar163._0_12_ = auVar161;
                auVar163[0xd] =
                     (0 < extraout_XMM0_Wf) * (extraout_XMM0_Wf < 0x100) * (char)extraout_XMM0_Wf -
                     (0xff < extraout_XMM0_Wf);
                auVar170[0xe] =
                     (0 < extraout_XMM0_Wg) * (extraout_XMM0_Wg < 0x100) * (char)extraout_XMM0_Wg -
                     (0xff < extraout_XMM0_Wg);
                auVar170._0_14_ = auVar163;
                auVar170[0xf] =
                     (0 < extraout_XMM0_Wh) * (extraout_XMM0_Wh < 0x100) * (char)extraout_XMM0_Wh -
                     (0xff < extraout_XMM0_Wh);
                auVar141._12_2_ = (short)((ulong)uVar125 >> 0x30);
                auVar141._0_12_ = auVar189;
                auVar141._14_2_ = (short)((ulong)uVar124 >> 0x30);
                auVar140._12_4_ = auVar141._12_4_;
                auVar140._10_2_ = (short)((uint6)uVar123 >> 0x20);
                auVar140._0_10_ = auVar189._0_10_;
                auVar139._10_6_ = auVar140._10_6_;
                auVar139._8_2_ = (short)((uint6)uVar159 >> 0x20);
                auVar139._0_8_ = uVar125;
                auVar138._8_8_ = auVar139._8_8_;
                auVar138._6_2_ = (short)((uint)uVar122 >> 0x10);
                auVar138._0_6_ = uVar159;
                auVar137._6_10_ = auVar138._6_10_;
                auVar137._4_2_ = (short)((uint)uVar158 >> 0x10);
                auVar137._0_4_ = uVar158;
                uVar122 = CONCAT22((short)((unkuint10)auVar161._0_10_ >> 0x40),
                                   (short)((unkuint10)auVar189._0_10_ >> 0x40));
                auVar190._0_8_ = CONCAT26(auVar161._10_2_,CONCAT24(auVar189._10_2_,uVar122));
                auVar190._8_2_ = auVar192._12_2_;
                auVar190._10_2_ = auVar163._12_2_;
                auVar201._12_2_ = auVar200._14_2_;
                auVar201._0_12_ = auVar190;
                auVar201._14_2_ = auVar170._14_2_;
                *(ulong *)((long)plVar114 + lVar100) = CONCAT44(uVar122,CONCAT22(uVar119,uVar156));
                *(ulong *)((long)plVar114 + lVar100 + lVar87) =
                     CONCAT44((int)((ulong)auVar190._0_8_ >> 0x20),auVar137._4_4_);
                *(ulong *)((long)plVar114 + lVar100 + lVar87 * 2) =
                     CONCAT44(auVar190._8_4_,auVar139._8_4_);
                *(ulong *)((long)plVar114 + lVar100 + lVar87 * 3) =
                     CONCAT44(auVar201._12_4_,auVar140._12_4_);
                s[0][0] = s[4][0];
                s[0][1] = s[4][1];
                s[1][0] = s[5][0];
                s[1][1] = s[5][1];
                s[2][0] = s[6][0];
                s[2][1] = s[6][1];
                lVar100 = lVar100 + 8;
                iVar117 = iVar117 + 4;
              } while (iVar117 != 0);
              local_388 = (longlong *)
                          ((long)local_388 + lVar100 + (int)(iVar112 * 8 + uVar106 * -2));
              plVar114 = (longlong *)((long)plVar114 + lVar100 + (int)(uVar106 * 6));
              uVar93 = uVar93 - 8;
            } while (uVar93 != 0);
            uVar93 = iVar105 + 7U & 0xfffffff8;
            uVar103 = iVar110 + 3U & 0xfffffffc;
            plVar114 = local_370;
            do {
              s[0][0] = *plVar114;
              s[0][1] = plVar114[1];
              s[1][0] = *(longlong *)((long)plVar114 + lVar87);
              s[1][1] = ((longlong *)((long)plVar114 + lVar87))[1];
              plVar3 = (longlong *)((long)plVar114 + (long)(int)uVar106 * 4);
              s[2][0] = *plVar3;
              s[2][1] = plVar3[1];
              plVar114 = (longlong *)((long)plVar114 + (long)(int)(uVar106 * 6));
              iVar112 = -uVar103;
              do {
                s[3][0] = *plVar114;
                s[3][1] = plVar114[1];
                s[4][0] = *(longlong *)((long)plVar114 + lVar87);
                s[4][1] = ((longlong *)((long)plVar114 + lVar87))[1];
                plVar3 = (longlong *)((long)plVar114 + lVar87 * 2);
                s[5][0] = *plVar3;
                s[5][1] = plVar3[1];
                plVar3 = (longlong *)((long)plVar114 + lVar87 * 3);
                s[6][0] = *plVar3;
                s[6][1] = plVar3[1];
                plVar114 = (longlong *)((long)plVar114 + (long)(int)(uVar106 << 3));
                convolve8_8_ssse3(s,f1);
                convolve8_8_ssse3(s + 1,f1);
                uStack_310 = extraout_XMM0_Qb_15;
                local_318 = (code *)extraout_XMM0_Qa_07;
                auVar145 = _local_318;
                convolve8_8_ssse3(s + 2,f1);
                convolve8_8_ssse3(s + 3,f1);
                local_308._0_2_ = (short)extraout_XMM0_Qa_06;
                local_308._2_2_ = (short)((ulong)extraout_XMM0_Qa_06 >> 0x10);
                local_308._4_2_ = (short)((ulong)extraout_XMM0_Qa_06 >> 0x20);
                local_308._6_2_ = (short)((ulong)extraout_XMM0_Qa_06 >> 0x30);
                sStack_300 = (short)extraout_XMM0_Qb_14;
                sStack_2fe = (short)((ulong)extraout_XMM0_Qb_14 >> 0x10);
                sStack_2fc = (short)((ulong)extraout_XMM0_Qb_14 >> 0x20);
                sStack_2fa = (short)((ulong)extraout_XMM0_Qb_14 >> 0x30);
                local_358._0_2_ = (short)extraout_XMM0_Qa_08;
                local_358._2_2_ = (short)((ulong)extraout_XMM0_Qa_08 >> 0x10);
                local_358._4_2_ = (short)((ulong)extraout_XMM0_Qa_08 >> 0x20);
                local_358._6_2_ = (short)((ulong)extraout_XMM0_Qa_08 >> 0x30);
                sStack_350 = (short)extraout_XMM0_Qb_16;
                sStack_34e = (short)((ulong)extraout_XMM0_Qb_16 >> 0x10);
                sStack_34c = (short)((ulong)extraout_XMM0_Qb_16 >> 0x20);
                sStack_34a = (short)((ulong)extraout_XMM0_Qb_16 >> 0x30);
                *(ulong *)puVar91 =
                     CONCAT17((0 < sStack_2fa) * (sStack_2fa < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_14 >> 0x30) - (0xff < sStack_2fa),
                              CONCAT16((0 < sStack_2fc) * (sStack_2fc < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_14 >> 0x20) -
                                       (0xff < sStack_2fc),
                                       CONCAT15((0 < sStack_2fe) * (sStack_2fe < 0x100) *
                                                (char)((ulong)extraout_XMM0_Qb_14 >> 0x10) -
                                                (0xff < sStack_2fe),
                                                CONCAT14((0 < sStack_300) * (sStack_300 < 0x100) *
                                                         (char)extraout_XMM0_Qb_14 -
                                                         (0xff < sStack_300),
                                                         CONCAT13((0 < local_308._6_2_) *
                                                                  (local_308._6_2_ < 0x100) *
                                                                  (char)((ulong)extraout_XMM0_Qa_06
                                                                        >> 0x30) -
                                                                  (0xff < local_308._6_2_),
                                                                  CONCAT12((0 < local_308._4_2_) *
                                                                           (local_308._4_2_ < 0x100)
                                                                           * (char)((ulong)
                                                  extraout_XMM0_Qa_06 >> 0x20) -
                                                  (0xff < local_308._4_2_),
                                                  CONCAT11((0 < local_308._2_2_) *
                                                           (local_308._2_2_ < 0x100) *
                                                           (char)((ulong)extraout_XMM0_Qa_06 >> 0x10
                                                                 ) - (0xff < local_308._2_2_),
                                                           (0 < (short)local_308) *
                                                           ((short)local_308 < 0x100) *
                                                           (char)extraout_XMM0_Qa_06 -
                                                           (0xff < (short)local_308))))))));
                local_318._0_2_ = (short)extraout_XMM0_Qa_07;
                local_318._2_2_ = (short)((ulong)extraout_XMM0_Qa_07 >> 0x10);
                local_318._4_2_ = (short)((ulong)extraout_XMM0_Qa_07 >> 0x20);
                local_318._6_2_ = (short)((ulong)extraout_XMM0_Qa_07 >> 0x30);
                uStack_310._0_2_ = (short)extraout_XMM0_Qb_15;
                uStack_310._2_2_ = (short)((ulong)extraout_XMM0_Qb_15 >> 0x10);
                uStack_310._4_2_ = (short)((ulong)extraout_XMM0_Qb_15 >> 0x20);
                uStack_310._6_2_ = (short)((ulong)extraout_XMM0_Qb_15 >> 0x30);
                *(ulong *)(puVar91 + lVar108) =
                     CONCAT17((0 < uStack_310._6_2_) * (uStack_310._6_2_ < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_15 >> 0x30) - (0xff < uStack_310._6_2_)
                              ,CONCAT16((0 < uStack_310._4_2_) * (uStack_310._4_2_ < 0x100) *
                                        (char)((ulong)extraout_XMM0_Qb_15 >> 0x20) -
                                        (0xff < uStack_310._4_2_),
                                        CONCAT15((0 < uStack_310._2_2_) * (uStack_310._2_2_ < 0x100)
                                                 * (char)((ulong)extraout_XMM0_Qb_15 >> 0x10) -
                                                 (0xff < uStack_310._2_2_),
                                                 CONCAT14((0 < (short)uStack_310) *
                                                          ((short)uStack_310 < 0x100) *
                                                          (char)extraout_XMM0_Qb_15 -
                                                          (0xff < (short)uStack_310),
                                                          CONCAT13((0 < local_318._6_2_) *
                                                                   (local_318._6_2_ < 0x100) *
                                                                   (char)((ulong)extraout_XMM0_Qa_07
                                                                         >> 0x30) -
                                                                   (0xff < local_318._6_2_),
                                                                   CONCAT12((0 < local_318._4_2_) *
                                                                            (local_318._4_2_ < 0x100
                                                                            ) * (char)((ulong)
                                                  extraout_XMM0_Qa_07 >> 0x20) -
                                                  (0xff < local_318._4_2_),
                                                  CONCAT11((0 < local_318._2_2_) *
                                                           (local_318._2_2_ < 0x100) *
                                                           (char)((ulong)extraout_XMM0_Qa_07 >> 0x10
                                                                 ) - (0xff < local_318._2_2_),
                                                           (0 < (short)local_318) *
                                                           ((short)local_318 < 0x100) *
                                                           (char)extraout_XMM0_Qa_07 -
                                                           (0xff < (short)local_318))))))));
                *(ulong *)(puVar91 + lVar108 * 2) =
                     CONCAT17((0 < sStack_34a) * (sStack_34a < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_16 >> 0x30) - (0xff < sStack_34a),
                              CONCAT16((0 < sStack_34c) * (sStack_34c < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_16 >> 0x20) -
                                       (0xff < sStack_34c),
                                       CONCAT15((0 < sStack_34e) * (sStack_34e < 0x100) *
                                                (char)((ulong)extraout_XMM0_Qb_16 >> 0x10) -
                                                (0xff < sStack_34e),
                                                CONCAT14((0 < sStack_350) * (sStack_350 < 0x100) *
                                                         (char)extraout_XMM0_Qb_16 -
                                                         (0xff < sStack_350),
                                                         CONCAT13((0 < local_358._6_2_) *
                                                                  (local_358._6_2_ < 0x100) *
                                                                  (char)((ulong)extraout_XMM0_Qa_08
                                                                        >> 0x30) -
                                                                  (0xff < local_358._6_2_),
                                                                  CONCAT12((0 < local_358._4_2_) *
                                                                           (local_358._4_2_ < 0x100)
                                                                           * (char)((ulong)
                                                  extraout_XMM0_Qa_08 >> 0x20) -
                                                  (0xff < local_358._4_2_),
                                                  CONCAT11((0 < local_358._2_2_) *
                                                           (local_358._2_2_ < 0x100) *
                                                           (char)((ulong)extraout_XMM0_Qa_08 >> 0x10
                                                                 ) - (0xff < local_358._2_2_),
                                                           (0 < (short)local_358) *
                                                           ((short)local_358 < 0x100) *
                                                           (char)extraout_XMM0_Qa_08 -
                                                           (0xff < (short)local_358))))))));
                *(ulong *)(puVar91 + lVar108 * 3) =
                     CONCAT17((0 < extraout_XMM0_Wh_00) * (extraout_XMM0_Wh_00 < 0x100) *
                              (char)extraout_XMM0_Wh_00 - (0xff < extraout_XMM0_Wh_00),
                              CONCAT16((0 < extraout_XMM0_Wg_00) * (extraout_XMM0_Wg_00 < 0x100) *
                                       (char)extraout_XMM0_Wg_00 - (0xff < extraout_XMM0_Wg_00),
                                       CONCAT15((0 < extraout_XMM0_Wf_00) *
                                                (extraout_XMM0_Wf_00 < 0x100) *
                                                (char)extraout_XMM0_Wf_00 -
                                                (0xff < extraout_XMM0_Wf_00),
                                                CONCAT14((0 < extraout_XMM0_We_00) *
                                                         (extraout_XMM0_We_00 < 0x100) *
                                                         (char)extraout_XMM0_We_00 -
                                                         (0xff < extraout_XMM0_We_00),
                                                         CONCAT13((0 < extraout_XMM0_Wd_00) *
                                                                  (extraout_XMM0_Wd_00 < 0x100) *
                                                                  (char)extraout_XMM0_Wd_00 -
                                                                  (0xff < extraout_XMM0_Wd_00),
                                                                  CONCAT12((0 < extraout_XMM0_Wc_00)
                                                                           * (extraout_XMM0_Wc_00 <
                                                                             0x100) *
                                                                           (char)extraout_XMM0_Wc_00
                                                                           - (0xff < 
                                                  extraout_XMM0_Wc_00),
                                                  CONCAT11((0 < extraout_XMM0_Wb_00) *
                                                           (extraout_XMM0_Wb_00 < 0x100) *
                                                           (char)extraout_XMM0_Wb_00 -
                                                           (0xff < extraout_XMM0_Wb_00),
                                                           (0 < extraout_XMM0_Wa_00) *
                                                           (extraout_XMM0_Wa_00 < 0x100) *
                                                           (char)extraout_XMM0_Wa_00 -
                                                           (0xff < extraout_XMM0_Wa_00))))))));
                s[0][0] = s[4][0];
                s[0][1] = s[4][1];
                s[1][0] = s[5][0];
                s[1][1] = s[5][1];
                s[2][0] = s[6][0];
                s[2][1] = s[6][1];
                puVar91 = puVar91 + lVar108 * 4;
                iVar112 = iVar112 + 4;
              } while (iVar112 != 0);
              plVar114 = (longlong *)
                         ((long)plVar114 + (0x10 - (long)(int)((iVar110 * 2 + 6U | 6) * uVar106)));
              puVar91 = puVar91 + (8 - (long)(int)(iVar102 * uVar103));
              uVar93 = uVar93 - 8;
              _local_318 = auVar145;
            } while (uVar93 != 0);
            goto LAB_0036ee77;
          }
          lVar87 = (long)*(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
          puVar91 = dst->store_buf_adr[uVar116 - 4];
          iVar112 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
          uVar93 = iVar105 + 0xfU & 0xfffffff0;
          auVar128 = ZEXT416(CONCAT22((short)((uint)*(int *)(av1_bilinear_filters[lVar98] + 4) >> 8)
                                      ,(ushort)(*(int *)(av1_bilinear_filters[lVar98] + 4) << 8) |
                                       av1_bilinear_filters[lVar98][3]));
          auVar128 = pshuflw(auVar128,auVar128,0);
          auVar129._0_4_ = auVar128._0_4_;
          auVar129._4_4_ = auVar129._0_4_;
          auVar129._8_4_ = auVar129._0_4_;
          auVar129._12_4_ = auVar129._0_4_;
          puVar92 = src->store_buf_adr[uVar116 - 4];
          do {
            puVar107 = puVar92 + (lVar87 - (int)uVar93) * 2;
            lVar108 = 0;
            do {
              auVar128 = pmaddubsw(*(undefined1 (*) [16])(puVar92 + lVar108 * 2),auVar129);
              auVar193 = pmaddubsw(*(undefined1 (*) [16])(puVar92 + lVar108 * 2 + 0x10),auVar129);
              auVar128 = paddsw(auVar128,auVar145);
              auVar193 = paddsw(auVar193,auVar145);
              auVar128 = psraw(auVar128,7);
              auVar193 = psraw(auVar193,7);
              sVar31 = auVar128._0_2_;
              sVar32 = auVar128._2_2_;
              sVar34 = auVar128._4_2_;
              sVar36 = auVar128._6_2_;
              sVar38 = auVar128._8_2_;
              sVar40 = auVar128._10_2_;
              sVar42 = auVar128._12_2_;
              sVar44 = auVar128._14_2_;
              cVar14 = (0 < sVar44) * (sVar44 < 0x100) * auVar128[0xe] - (0xff < sVar44);
              sVar46 = auVar193._0_2_;
              sVar48 = auVar193._2_2_;
              sVar50 = auVar193._4_2_;
              sVar52 = auVar193._6_2_;
              sVar54 = auVar193._8_2_;
              sVar56 = auVar193._10_2_;
              sVar58 = auVar193._12_2_;
              sVar60 = auVar193._14_2_;
              auVar194 = pmaddubsw(*(undefined1 (*) [16])(puVar92 + lVar108 * 2 + lVar87),auVar129);
              auVar205 = pmaddubsw(*(undefined1 (*) [16])(puVar92 + lVar108 * 2 + lVar87 + 0x10),
                                   auVar129);
              auVar194 = paddsw(auVar194,auVar145);
              auVar205 = paddsw(auVar205,auVar145);
              auVar194 = psraw(auVar194,7);
              auVar205 = psraw(auVar205,7);
              sVar44 = auVar194._0_2_;
              sVar33 = auVar194._2_2_;
              sVar35 = auVar194._4_2_;
              sVar37 = auVar194._6_2_;
              sVar39 = auVar194._8_2_;
              sVar41 = auVar194._10_2_;
              sVar43 = auVar194._12_2_;
              sVar45 = auVar194._14_2_;
              sVar47 = auVar205._0_2_;
              sVar49 = auVar205._2_2_;
              sVar51 = auVar205._4_2_;
              sVar53 = auVar205._6_2_;
              sVar55 = auVar205._8_2_;
              sVar57 = auVar205._10_2_;
              sVar59 = auVar205._12_2_;
              sVar61 = auVar205._14_2_;
              auVar206._8_8_ =
                   (undefined8)
                   (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11((0 < sVar45) *
                                                                                   (sVar45 < 0x100)
                                                                                   * auVar194[0xe] -
                                                                                   (0xff < sVar45),
                                                                                   cVar14),
                                                                          (0 < sVar43) *
                                                                          (sVar43 < 0x100) *
                                                                          auVar194[0xc] -
                                                                          (0xff < sVar43)),
                                                                 (0 < sVar42) * (sVar42 < 0x100) *
                                                                 auVar128[0xc] - (0xff < sVar42)),
                                                        (0 < sVar41) * (sVar41 < 0x100) *
                                                        auVar194[10] - (0xff < sVar41)),
                                               (0 < sVar40) * (sVar40 < 0x100) * auVar128[10] -
                                               (0xff < sVar40)),
                                      (0 < sVar39) * (sVar39 < 0x100) * auVar194[8] -
                                      (0xff < sVar39)),
                             CONCAT11((0 < sVar38) * (sVar38 < 0x100) * auVar128[8] -
                                      (0xff < sVar38),cVar14)) >> 8);
              auVar206[7] = (0 < sVar37) * (sVar37 < 0x100) * auVar194[6] - (0xff < sVar37);
              auVar206[6] = (0 < sVar36) * (sVar36 < 0x100) * auVar128[6] - (0xff < sVar36);
              auVar206[5] = (0 < sVar35) * (sVar35 < 0x100) * auVar194[4] - (0xff < sVar35);
              auVar206[4] = (0 < sVar34) * (sVar34 < 0x100) * auVar128[4] - (0xff < sVar34);
              auVar206[3] = (0 < sVar33) * (sVar33 < 0x100) * auVar194[2] - (0xff < sVar33);
              auVar206[2] = (0 < sVar32) * (sVar32 < 0x100) * auVar128[2] - (0xff < sVar32);
              auVar206[1] = (0 < sVar44) * (sVar44 < 0x100) * auVar194[0] - (0xff < sVar44);
              auVar206[0] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[0] - (0xff < sVar31);
              auVar164[1] = (0 < sVar47) * (sVar47 < 0x100) * auVar205[0] - (0xff < sVar47);
              auVar164[0] = (0 < sVar46) * (sVar46 < 0x100) * auVar193[0] - (0xff < sVar46);
              auVar164[2] = (0 < sVar48) * (sVar48 < 0x100) * auVar193[2] - (0xff < sVar48);
              auVar164[3] = (0 < sVar49) * (sVar49 < 0x100) * auVar205[2] - (0xff < sVar49);
              auVar164[4] = (0 < sVar50) * (sVar50 < 0x100) * auVar193[4] - (0xff < sVar50);
              auVar164[5] = (0 < sVar51) * (sVar51 < 0x100) * auVar205[4] - (0xff < sVar51);
              auVar164[6] = (0 < sVar52) * (sVar52 < 0x100) * auVar193[6] - (0xff < sVar52);
              auVar164[7] = (0 < sVar53) * (sVar53 < 0x100) * auVar205[6] - (0xff < sVar53);
              auVar164[8] = (0 < sVar54) * (sVar54 < 0x100) * auVar193[8] - (0xff < sVar54);
              auVar164[9] = (0 < sVar55) * (sVar55 < 0x100) * auVar205[8] - (0xff < sVar55);
              auVar164[10] = (0 < sVar56) * (sVar56 < 0x100) * auVar193[10] - (0xff < sVar56);
              auVar164[0xb] = (0 < sVar57) * (sVar57 < 0x100) * auVar205[10] - (0xff < sVar57);
              auVar164[0xc] = (0 < sVar58) * (sVar58 < 0x100) * auVar193[0xc] - (0xff < sVar58);
              auVar164[0xd] = (0 < sVar59) * (sVar59 < 0x100) * auVar205[0xc] - (0xff < sVar59);
              auVar164[0xe] = (0 < sVar60) * (sVar60 < 0x100) * auVar193[0xe] - (0xff < sVar60);
              auVar164[0xf] = (0 < sVar61) * (sVar61 < 0x100) * auVar205[0xe] - (0xff < sVar61);
              auVar193 = pmaddubsw(auVar206,auVar129);
              auVar128 = pmaddubsw(auVar164,auVar129);
              auVar193 = paddsw(auVar193,auVar145);
              auVar128 = paddsw(auVar128,auVar145);
              auVar193 = psraw(auVar193,7);
              auVar128 = psraw(auVar128,7);
              sVar31 = auVar193._0_2_;
              sVar44 = auVar193._2_2_;
              sVar32 = auVar193._4_2_;
              sVar33 = auVar193._6_2_;
              sVar34 = auVar193._8_2_;
              sVar35 = auVar193._10_2_;
              sVar36 = auVar193._12_2_;
              sVar37 = auVar193._14_2_;
              sVar38 = auVar128._0_2_;
              sVar39 = auVar128._2_2_;
              sVar40 = auVar128._4_2_;
              sVar41 = auVar128._6_2_;
              sVar42 = auVar128._8_2_;
              sVar43 = auVar128._10_2_;
              sVar45 = auVar128._12_2_;
              sVar46 = auVar128._14_2_;
              puVar1 = puVar91 + lVar108;
              *puVar1 = (0 < sVar31) * (sVar31 < 0x100) * auVar193[0] - (0xff < sVar31);
              puVar1[1] = (0 < sVar44) * (sVar44 < 0x100) * auVar193[2] - (0xff < sVar44);
              puVar1[2] = (0 < sVar32) * (sVar32 < 0x100) * auVar193[4] - (0xff < sVar32);
              puVar1[3] = (0 < sVar33) * (sVar33 < 0x100) * auVar193[6] - (0xff < sVar33);
              puVar1[4] = (0 < sVar34) * (sVar34 < 0x100) * auVar193[8] - (0xff < sVar34);
              puVar1[5] = (0 < sVar35) * (sVar35 < 0x100) * auVar193[10] - (0xff < sVar35);
              puVar1[6] = (0 < sVar36) * (sVar36 < 0x100) * auVar193[0xc] - (0xff < sVar36);
              puVar1[7] = (0 < sVar37) * (sVar37 < 0x100) * auVar193[0xe] - (0xff < sVar37);
              puVar1[8] = (0 < sVar38) * (sVar38 < 0x100) * auVar128[0] - (0xff < sVar38);
              puVar1[9] = (0 < sVar39) * (sVar39 < 0x100) * auVar128[2] - (0xff < sVar39);
              puVar1[10] = (0 < sVar40) * (sVar40 < 0x100) * auVar128[4] - (0xff < sVar40);
              puVar1[0xb] = (0 < sVar41) * (sVar41 < 0x100) * auVar128[6] - (0xff < sVar41);
              puVar1[0xc] = (0 < sVar42) * (sVar42 < 0x100) * auVar128[8] - (0xff < sVar42);
              puVar1[0xd] = (0 < sVar43) * (sVar43 < 0x100) * auVar128[10] - (0xff < sVar43);
              puVar1[0xe] = (0 < sVar45) * (sVar45 < 0x100) * auVar128[0xc] - (0xff < sVar45);
              puVar1[0xf] = (0 < sVar46) * (sVar46 < 0x100) * auVar128[0xe] - (0xff < sVar46);
              lVar108 = lVar108 + 0x10;
              puVar107 = puVar107 + 0x20;
            } while (uVar93 != (uint)lVar108);
            puVar91 = puVar91 + lVar108 + ((long)iVar112 - (long)(int)uVar93);
            iVar110 = iVar110 + -1;
            puVar92 = puVar107;
          } while (iVar110 != 0);
        }
      }
      else {
        iVar115 = iVar110 * 4;
        iVar102 = (int)uVar104;
        if ((iVar105 * 4 == iVar112) && (iVar115 == iVar117)) {
          if (phase == 0) {
            puVar91 = src->store_buf_adr[uVar116 - 4];
            iVar112 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            puVar92 = dst->store_buf_adr[uVar116 - 4];
            iVar117 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            uVar93 = iVar105 + 0xfU & 0xfffffff0;
            do {
              lVar108 = 0;
              lVar87 = (long)(int)uVar93 * 4 + (long)iVar112 * -4;
              do {
                puVar2 = (ushort *)(puVar91 + lVar108 * 4);
                puVar8 = (ushort *)(puVar91 + lVar108 * 4 + 0x10);
                puVar9 = (ushort *)(puVar91 + lVar108 * 4 + 0x20);
                puVar10 = (ushort *)(puVar91 + lVar108 * 4 + 0x30);
                uVar121 = *puVar2 & 0xff;
                uVar148 = puVar2[2] & 0xff;
                uVar151 = puVar2[4] & 0xff;
                uVar154 = puVar2[6] & 0xff;
                uVar203 = *puVar8 & 0xff;
                uVar212 = puVar8[2] & 0xff;
                uVar213 = puVar8[4] & 0xff;
                uVar214 = puVar8[6] & 0xff;
                bVar15 = (uVar121 != 0) * (uVar121 < 0x100) * (char)*puVar2 - (0xff < uVar121);
                bVar16 = (uVar148 != 0) * (uVar148 < 0x100) * (char)puVar2[2] - (0xff < uVar148);
                bVar17 = (uVar151 != 0) * (uVar151 < 0x100) * (char)puVar2[4] - (0xff < uVar151);
                bVar18 = (uVar154 != 0) * (uVar154 < 0x100) * (char)puVar2[6] - (0xff < uVar154);
                bVar19 = (uVar203 != 0) * (uVar203 < 0x100) * (char)*puVar8 - (0xff < uVar203);
                bVar20 = (uVar212 != 0) * (uVar212 < 0x100) * (char)puVar8[2] - (0xff < uVar212);
                bVar21 = (uVar213 != 0) * (uVar213 < 0x100) * (char)puVar8[4] - (0xff < uVar213);
                bVar22 = (uVar214 != 0) * (uVar214 < 0x100) * (char)puVar8[6] - (0xff < uVar214);
                uVar121 = *puVar9 & 0xff;
                uVar148 = puVar9[2] & 0xff;
                uVar151 = puVar9[4] & 0xff;
                uVar154 = puVar9[6] & 0xff;
                uVar203 = *puVar10 & 0xff;
                uVar212 = puVar10[2] & 0xff;
                uVar213 = puVar10[4] & 0xff;
                uVar214 = puVar10[6] & 0xff;
                bVar23 = (uVar121 != 0) * (uVar121 < 0x100) * (char)*puVar9 - (0xff < uVar121);
                bVar24 = (uVar148 != 0) * (uVar148 < 0x100) * (char)puVar9[2] - (0xff < uVar148);
                bVar25 = (uVar151 != 0) * (uVar151 < 0x100) * (char)puVar9[4] - (0xff < uVar151);
                bVar26 = (uVar154 != 0) * (uVar154 < 0x100) * (char)puVar9[6] - (0xff < uVar154);
                bVar27 = (uVar203 != 0) * (uVar203 < 0x100) * (char)*puVar10 - (0xff < uVar203);
                bVar28 = (uVar212 != 0) * (uVar212 < 0x100) * (char)puVar10[2] - (0xff < uVar212);
                bVar29 = (uVar213 != 0) * (uVar213 < 0x100) * (char)puVar10[4] - (0xff < uVar213);
                bVar30 = (uVar214 != 0) * (uVar214 < 0x100) * (char)puVar10[6] - (0xff < uVar214);
                puVar107 = puVar92 + lVar108;
                *puVar107 = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
                puVar107[1] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
                puVar107[2] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
                puVar107[3] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
                puVar107[4] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
                puVar107[5] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
                puVar107[6] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
                puVar107[7] = (bVar22 != 0) * (bVar22 < 0x100) * bVar22 - (0xff < bVar22);
                puVar107[8] = (bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23);
                puVar107[9] = (bVar24 != 0) * (bVar24 < 0x100) * bVar24 - (0xff < bVar24);
                puVar107[10] = (bVar25 != 0) * (bVar25 < 0x100) * bVar25 - (0xff < bVar25);
                puVar107[0xb] = (bVar26 != 0) * (bVar26 < 0x100) * bVar26 - (0xff < bVar26);
                puVar107[0xc] = (bVar27 != 0) * (bVar27 < 0x100) * bVar27 - (0xff < bVar27);
                puVar107[0xd] = (bVar28 != 0) * (bVar28 < 0x100) * bVar28 - (0xff < bVar28);
                puVar107[0xe] = (bVar29 != 0) * (bVar29 < 0x100) * bVar29 - (0xff < bVar29);
                puVar107[0xf] = (bVar30 != 0) * (bVar30 < 0x100) * bVar30 - (0xff < bVar30);
                lVar108 = lVar108 + 0x10;
                lVar87 = lVar87 + -0x40;
              } while (uVar93 != (uint)lVar108);
              puVar91 = puVar91 + -lVar87;
              puVar92 = puVar92 + lVar108 + ((long)iVar117 - (long)(int)uVar93);
              iVar110 = iVar110 + -1;
            } while (iVar110 != 0);
          }
          else {
            if (filter != BILINEAR) {
              local_370 = (longlong *)
                          malloc((long)(int)((((int)uVar99 << 2 | 6U) + 7 & 0xfffffff8) * iVar102 +
                                            0x10));
              if (local_370 == (longlong *)0x0) goto LAB_0036eef8;
              iVar112 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
              puVar91 = dst->store_buf_adr[uVar116 - 4];
              iVar102 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
              uVar106 = iVar105 + 1U & 0xfffffffe;
              uVar93 = iVar117 + 0xdU & 0xfffffff8;
              auVar145 = *(undefined1 (*) [16])(pIVar89->filter_ptr + lVar98 * 8);
              f1[0] = (__m128i)pshufb(auVar145,_DAT_0046b2b0);
              f1[1] = (__m128i)pshufb(auVar145,_DAT_0046b2c0);
              f1[2] = (__m128i)pshufb(auVar145,_DAT_0046b2d0);
              f1[3] = (__m128i)pshufb(auVar145,_DAT_0046b2e0);
              lVar108 = (long)(int)uVar106;
              lVar87 = lVar108 * 2;
              local_318 = (code *)(lVar108 * 6);
              plVar114 = local_370;
              puVar92 = src->store_buf_adr[uVar116 - 4] + (iVar112 * -3 + -7);
              do {
                load_8bit_8x8(puVar92 + 4,(long)iVar112,s);
                transpose_16bit_4x8(s,s);
                puVar107 = puVar92 + (int)(iVar112 * 8 + uVar106 * -4);
                iVar117 = -uVar106;
                do {
                  puVar92 = puVar92 + 8;
                  palVar11 = s + 2;
                  load_8bit_8x8(puVar92,(long)iVar112,palVar11);
                  transpose_16bit_4x8(palVar11,palVar11);
                  convolve8_8_ssse3(s,f1);
                  convolve8_8_ssse3(palVar11,f1);
                  local_358._0_2_ = (short)extraout_XMM0_Qa_11;
                  local_358._2_2_ = (short)((ulong)extraout_XMM0_Qa_11 >> 0x10);
                  local_358._4_2_ = (short)((ulong)extraout_XMM0_Qa_11 >> 0x20);
                  local_358._6_2_ = (short)((ulong)extraout_XMM0_Qa_11 >> 0x30);
                  sStack_350 = (short)extraout_XMM0_Qb_17;
                  sStack_34e = (short)((ulong)extraout_XMM0_Qb_17 >> 0x10);
                  sStack_34c = (short)((ulong)extraout_XMM0_Qb_17 >> 0x20);
                  sStack_34a = (short)((ulong)extraout_XMM0_Qb_17 >> 0x30);
                  cVar14 = (char)((ulong)extraout_XMM0_Qa_11 >> 0x10);
                  uVar156 = CONCAT11((0 < local_358._2_2_) * (local_358._2_2_ < 0x100) * cVar14 -
                                     (0xff < local_358._2_2_),
                                     (0 < (short)local_358) * ((short)local_358 < 0x100) *
                                     (char)extraout_XMM0_Qa_11 - (0xff < (short)local_358));
                  cVar62 = (char)((ulong)extraout_XMM0_Qa_11 >> 0x20);
                  cVar63 = (char)((ulong)extraout_XMM0_Qa_11 >> 0x30);
                  auVar171._0_4_ =
                       CONCAT13((0 < local_358._6_2_) * (local_358._6_2_ < 0x100) * cVar63 -
                                (0xff < local_358._6_2_),
                                CONCAT12((0 < local_358._4_2_) * (local_358._4_2_ < 0x100) * cVar62
                                         - (0xff < local_358._4_2_),uVar156));
                  auVar172._0_6_ =
                       CONCAT15((0 < sStack_34e) * (sStack_34e < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb_17 >> 0x10) - (0xff < sStack_34e),
                                CONCAT14((0 < sStack_350) * (sStack_350 < 0x100) *
                                         (char)extraout_XMM0_Qb_17 - (0xff < sStack_350),
                                         auVar171._0_4_));
                  auVar173._0_8_ =
                       CONCAT17((0 < sStack_34a) * (sStack_34a < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb_17 >> 0x30) - (0xff < sStack_34a),
                                CONCAT16((0 < sStack_34c) * (sStack_34c < 0x100) *
                                         (char)((ulong)extraout_XMM0_Qb_17 >> 0x20) -
                                         (0xff < sStack_34c),auVar172._0_6_));
                  auVar174._0_10_ =
                       CONCAT19((0 < local_358._2_2_) * (local_358._2_2_ < 0x100) * cVar14 -
                                (0xff < local_358._2_2_),
                                CONCAT18((0 < (short)local_358) * ((short)local_358 < 0x100) *
                                         (char)extraout_XMM0_Qa_11 - (0xff < (short)local_358),
                                         auVar173._0_8_));
                  auVar175[10] = (0 < local_358._4_2_) * (local_358._4_2_ < 0x100) * cVar62 -
                                 (0xff < local_358._4_2_);
                  auVar175._0_10_ = auVar174._0_10_;
                  auVar175[0xb] =
                       (0 < local_358._6_2_) * (local_358._6_2_ < 0x100) * cVar63 -
                       (0xff < local_358._6_2_);
                  uVar119 = CONCAT11((0 < extraout_XMM0_Wb_01) * (extraout_XMM0_Wb_01 < 0x100) *
                                     (char)extraout_XMM0_Wb_01 - (0xff < extraout_XMM0_Wb_01),
                                     (0 < extraout_XMM0_Wa_01) * (extraout_XMM0_Wa_01 < 0x100) *
                                     (char)extraout_XMM0_Wa_01 - (0xff < extraout_XMM0_Wa_01));
                  uVar122 = CONCAT13((0 < extraout_XMM0_Wd_01) * (extraout_XMM0_Wd_01 < 0x100) *
                                     (char)extraout_XMM0_Wd_01 - (0xff < extraout_XMM0_Wd_01),
                                     CONCAT12((0 < extraout_XMM0_Wc_01) *
                                              (extraout_XMM0_Wc_01 < 0x100) *
                                              (char)extraout_XMM0_Wc_01 -
                                              (0xff < extraout_XMM0_Wc_01),uVar119));
                  uVar123 = CONCAT15((0 < extraout_XMM0_Wf_01) * (extraout_XMM0_Wf_01 < 0x100) *
                                     (char)extraout_XMM0_Wf_01 - (0xff < extraout_XMM0_Wf_01),
                                     CONCAT14((0 < extraout_XMM0_We_01) *
                                              (extraout_XMM0_We_01 < 0x100) *
                                              (char)extraout_XMM0_We_01 -
                                              (0xff < extraout_XMM0_We_01),uVar122));
                  auVar175._12_2_ = (short)((ulong)auVar173._0_8_ >> 0x30);
                  auVar175._14_2_ =
                       (short)(CONCAT17((0 < extraout_XMM0_Wh_01) * (extraout_XMM0_Wh_01 < 0x100) *
                                        (char)extraout_XMM0_Wh_01 - (0xff < extraout_XMM0_Wh_01),
                                        CONCAT16((0 < extraout_XMM0_Wg_01) *
                                                 (extraout_XMM0_Wg_01 < 0x100) *
                                                 (char)extraout_XMM0_Wg_01 -
                                                 (0xff < extraout_XMM0_Wg_01),uVar123)) >> 0x30);
                  auVar174._12_4_ = auVar175._12_4_;
                  auVar174._10_2_ = (short)((uint6)uVar123 >> 0x20);
                  auVar173._10_6_ = auVar174._10_6_;
                  auVar173._8_2_ = (short)((uint6)auVar172._0_6_ >> 0x20);
                  auVar172._8_8_ = auVar173._8_8_;
                  auVar172._6_2_ = (short)((uint)uVar122 >> 0x10);
                  auVar171._6_10_ = auVar172._6_10_;
                  auVar171._4_2_ = (short)((uint)auVar171._0_4_ >> 0x10);
                  *(uint *)plVar114 = CONCAT22(uVar119,uVar156);
                  *(int *)((long)plVar114 + lVar87) = auVar171._4_4_;
                  *(int *)((long)plVar114 + lVar108 * 4) = auVar173._8_4_;
                  *(undefined4 *)((long)plVar114 + (long)local_318) = auVar174._12_4_;
                  s[0][0] = s[4][0];
                  s[0][1] = s[4][1];
                  s[1][0] = s[5][0];
                  s[1][1] = s[5][1];
                  plVar114 = (longlong *)((long)plVar114 + 4);
                  puVar107 = puVar107 + 8;
                  iVar117 = iVar117 + 2;
                } while (iVar117 != 0);
                plVar114 = (longlong *)((long)plVar114 + (long)(int)(uVar106 * 6));
                uVar93 = uVar93 - 8;
                puVar92 = puVar107;
              } while (uVar93 != 0);
              uVar93 = iVar105 + 7U & 0xfffffff8;
              uVar103 = iVar110 + 1U & 0xfffffffe;
              plVar114 = local_370;
              do {
                s[0][0] = *plVar114;
                s[0][1] = plVar114[1];
                s[1][0] = *(longlong *)((long)plVar114 + lVar87);
                s[1][1] = ((longlong *)((long)plVar114 + lVar87))[1];
                plVar114 = (longlong *)((long)plVar114 + (long)(int)(uVar106 * 4));
                iVar112 = -uVar103;
                do {
                  s[2][0] = *plVar114;
                  s[2][1] = plVar114[1];
                  s[3][0] = *(longlong *)((long)plVar114 + lVar87);
                  s[3][1] = ((longlong *)((long)plVar114 + lVar87))[1];
                  plVar3 = (longlong *)((long)plVar114 + lVar108 * 4);
                  s[4][0] = *plVar3;
                  s[4][1] = plVar3[1];
                  s[5][0] = *(longlong *)((long)plVar114 + (long)local_318);
                  s[5][1] = ((longlong *)((long)plVar114 + (long)local_318))[1];
                  plVar114 = (longlong *)((long)plVar114 + (long)(int)(uVar106 << 3));
                  convolve8_8_ssse3(s,f1);
                  convolve8_8_ssse3(s + 2,f1);
                  local_358._0_2_ = (short)extraout_XMM0_Qa_12;
                  local_358._2_2_ = (short)((ulong)extraout_XMM0_Qa_12 >> 0x10);
                  local_358._4_2_ = (short)((ulong)extraout_XMM0_Qa_12 >> 0x20);
                  local_358._6_2_ = (short)((ulong)extraout_XMM0_Qa_12 >> 0x30);
                  sStack_350 = (short)extraout_XMM0_Qb_18;
                  sStack_34e = (short)((ulong)extraout_XMM0_Qb_18 >> 0x10);
                  sStack_34c = (short)((ulong)extraout_XMM0_Qb_18 >> 0x20);
                  sStack_34a = (short)((ulong)extraout_XMM0_Qb_18 >> 0x30);
                  *(ulong *)puVar91 =
                       CONCAT17((0 < sStack_34a) * (sStack_34a < 0x100) *
                                (char)((ulong)extraout_XMM0_Qb_18 >> 0x30) - (0xff < sStack_34a),
                                CONCAT16((0 < sStack_34c) * (sStack_34c < 0x100) *
                                         (char)((ulong)extraout_XMM0_Qb_18 >> 0x20) -
                                         (0xff < sStack_34c),
                                         CONCAT15((0 < sStack_34e) * (sStack_34e < 0x100) *
                                                  (char)((ulong)extraout_XMM0_Qb_18 >> 0x10) -
                                                  (0xff < sStack_34e),
                                                  CONCAT14((0 < sStack_350) * (sStack_350 < 0x100) *
                                                           (char)extraout_XMM0_Qb_18 -
                                                           (0xff < sStack_350),
                                                           CONCAT13((0 < local_358._6_2_) *
                                                                    (local_358._6_2_ < 0x100) *
                                                                    (char)((ulong)
                                                  extraout_XMM0_Qa_12 >> 0x30) -
                                                  (0xff < local_358._6_2_),
                                                  CONCAT12((0 < local_358._4_2_) *
                                                           (local_358._4_2_ < 0x100) *
                                                           (char)((ulong)extraout_XMM0_Qa_12 >> 0x20
                                                                 ) - (0xff < local_358._4_2_),
                                                           CONCAT11((0 < local_358._2_2_) *
                                                                    (local_358._2_2_ < 0x100) *
                                                                    (char)((ulong)
                                                  extraout_XMM0_Qa_12 >> 0x10) -
                                                  (0xff < local_358._2_2_),
                                                  (0 < (short)local_358) *
                                                  ((short)local_358 < 0x100) *
                                                  (char)extraout_XMM0_Qa_12 -
                                                  (0xff < (short)local_358))))))));
                  *(ulong *)(puVar91 + iVar102) =
                       CONCAT17((0 < extraout_XMM0_Wh_02) * (extraout_XMM0_Wh_02 < 0x100) *
                                (char)extraout_XMM0_Wh_02 - (0xff < extraout_XMM0_Wh_02),
                                CONCAT16((0 < extraout_XMM0_Wg_02) * (extraout_XMM0_Wg_02 < 0x100) *
                                         (char)extraout_XMM0_Wg_02 - (0xff < extraout_XMM0_Wg_02),
                                         CONCAT15((0 < extraout_XMM0_Wf_02) *
                                                  (extraout_XMM0_Wf_02 < 0x100) *
                                                  (char)extraout_XMM0_Wf_02 -
                                                  (0xff < extraout_XMM0_Wf_02),
                                                  CONCAT14((0 < extraout_XMM0_We_02) *
                                                           (extraout_XMM0_We_02 < 0x100) *
                                                           (char)extraout_XMM0_We_02 -
                                                           (0xff < extraout_XMM0_We_02),
                                                           CONCAT13((0 < extraout_XMM0_Wd_02) *
                                                                    (extraout_XMM0_Wd_02 < 0x100) *
                                                                    (char)extraout_XMM0_Wd_02 -
                                                                    (0xff < extraout_XMM0_Wd_02),
                                                                    CONCAT12((0 < 
                                                  extraout_XMM0_Wc_02) *
                                                  (extraout_XMM0_Wc_02 < 0x100) *
                                                  (char)extraout_XMM0_Wc_02 -
                                                  (0xff < extraout_XMM0_Wc_02),
                                                  CONCAT11((0 < extraout_XMM0_Wb_02) *
                                                           (extraout_XMM0_Wb_02 < 0x100) *
                                                           (char)extraout_XMM0_Wb_02 -
                                                           (0xff < extraout_XMM0_Wb_02),
                                                           (0 < extraout_XMM0_Wa_02) *
                                                           (extraout_XMM0_Wa_02 < 0x100) *
                                                           (char)extraout_XMM0_Wa_02 -
                                                           (0xff < extraout_XMM0_Wa_02))))))));
                  s[0][0] = s[4][0];
                  s[0][1] = s[4][1];
                  s[1][0] = s[5][0];
                  s[1][1] = s[5][1];
                  puVar91 = puVar91 + (long)iVar102 * 2;
                  iVar112 = iVar112 + 2;
                } while (iVar112 != 0);
                plVar114 = (longlong *)
                           ((long)plVar114 + (0x10 - (long)(int)((iVar110 * 4 + 4U | 4) * uVar106)))
                ;
                puVar91 = puVar91 + (8 - (long)(int)(iVar102 * uVar103));
                uVar93 = uVar93 - 8;
              } while (uVar93 != 0);
              goto LAB_0036ee77;
            }
            lVar87 = (long)*(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            puVar91 = dst->store_buf_adr[uVar116 - 4];
            iVar112 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            uVar93 = iVar105 + 0xfU & 0xfffffff0;
            auVar128 = ZEXT416(CONCAT22((short)((uint)*(int *)(av1_bilinear_filters[lVar98] + 4) >>
                                               8),
                                        (ushort)(*(int *)(av1_bilinear_filters[lVar98] + 4) << 8) |
                                        av1_bilinear_filters[lVar98][3]));
            auVar128 = pshuflw(auVar128,auVar128,0);
            auVar130._0_4_ = auVar128._0_4_;
            auVar130._4_4_ = auVar130._0_4_;
            auVar130._8_4_ = auVar130._0_4_;
            auVar130._12_4_ = auVar130._0_4_;
            puVar92 = src->store_buf_adr[uVar116 - 4];
            do {
              puVar107 = puVar92 + (lVar87 - (int)uVar93) * 4;
              lVar108 = 0;
              do {
                auVar128 = *(undefined1 (*) [16])(puVar92 + lVar108 * 4);
                auVar193 = *(undefined1 (*) [16])(puVar92 + lVar108 * 4 + 0x10);
                auVar194 = *(undefined1 (*) [16])(puVar92 + lVar108 * 4 + 0x20);
                auVar205 = *(undefined1 (*) [16])(puVar92 + lVar108 * 4 + 0x30);
                puVar5 = puVar92 + lVar108 * 4 + lVar87;
                puVar6 = puVar92 + lVar108 * 4 + lVar87 + 0x10;
                puVar7 = puVar92 + lVar108 * 4 + lVar87 + 0x20;
                puVar1 = puVar92 + lVar108 * 4 + lVar87 + 0x30;
                auVar230._0_12_ = auVar128._0_12_;
                auVar230._12_2_ = auVar128._6_2_;
                auVar230._14_2_ = *(undefined2 *)(puVar5 + 6);
                auVar229._12_4_ = auVar230._12_4_;
                auVar229._0_10_ = auVar128._0_10_;
                auVar229._10_2_ = *(undefined2 *)(puVar5 + 4);
                auVar228._10_6_ = auVar229._10_6_;
                auVar228._0_8_ = auVar128._0_8_;
                auVar228._8_2_ = auVar128._4_2_;
                uVar227 = CONCAT22(*(undefined2 *)puVar5,auVar128._0_2_);
                uVar122 = CONCAT22(*(undefined2 *)(puVar5 + 8),auVar128._8_2_);
                auVar166._14_2_ = *(undefined2 *)(puVar5 + 0xc);
                auVar166._12_2_ = auVar128._12_2_;
                auVar234._0_12_ = auVar193._0_12_;
                auVar234._12_2_ = auVar193._6_2_;
                auVar234._14_2_ = *(undefined2 *)(puVar6 + 6);
                auVar233._12_4_ = auVar234._12_4_;
                auVar233._0_10_ = auVar193._0_10_;
                auVar233._10_2_ = *(undefined2 *)(puVar6 + 4);
                auVar232._10_6_ = auVar233._10_6_;
                auVar232._0_8_ = auVar193._0_8_;
                auVar232._8_2_ = auVar193._4_2_;
                uVar231 = CONCAT22(*(undefined2 *)puVar6,auVar193._0_2_);
                uVar204 = CONCAT22(*(undefined2 *)(puVar6 + 8),auVar193._8_2_);
                auVar226._14_2_ = *(undefined2 *)(puVar6 + 0xc);
                auVar226._12_2_ = auVar193._12_2_;
                auVar220._0_12_ = auVar194._0_12_;
                auVar220._12_2_ = auVar194._6_2_;
                auVar220._14_2_ = *(undefined2 *)(puVar7 + 6);
                auVar219._12_4_ = auVar220._12_4_;
                auVar219._0_10_ = auVar194._0_10_;
                auVar219._10_2_ = *(undefined2 *)(puVar7 + 4);
                auVar218._10_6_ = auVar219._10_6_;
                auVar218._0_8_ = auVar194._0_8_;
                auVar218._8_2_ = auVar194._4_2_;
                uVar217 = CONCAT22(*(undefined2 *)puVar7,auVar194._0_2_);
                uVar184 = CONCAT22(*(undefined2 *)(puVar7 + 8),auVar194._8_2_);
                auVar196._14_2_ = *(undefined2 *)(puVar7 + 0xc);
                auVar196._12_2_ = auVar194._12_2_;
                auVar224._0_12_ = auVar205._0_12_;
                auVar224._12_2_ = auVar205._6_2_;
                auVar224._14_2_ = *(undefined2 *)(puVar1 + 6);
                auVar223._12_4_ = auVar224._12_4_;
                auVar223._0_10_ = auVar205._0_10_;
                auVar223._10_2_ = *(undefined2 *)(puVar1 + 4);
                auVar222._10_6_ = auVar223._10_6_;
                auVar222._0_8_ = auVar205._0_8_;
                auVar222._8_2_ = auVar205._4_2_;
                uVar221 = CONCAT22(*(undefined2 *)puVar1,auVar205._0_2_);
                uVar158 = CONCAT22(*(undefined2 *)(puVar1 + 8),auVar205._8_2_);
                auVar216._14_2_ = *(undefined2 *)(puVar1 + 0xc);
                auVar216._12_2_ = auVar205._12_2_;
                auVar166._4_4_ = uVar122;
                auVar166._0_4_ = uVar227;
                auVar166._8_4_ = uVar122;
                auVar165._8_8_ = auVar166._8_8_;
                auVar165._4_4_ = auVar228._8_4_;
                auVar165._0_4_ = uVar227;
                auVar226._4_4_ = uVar204;
                auVar226._0_4_ = uVar231;
                auVar226._8_4_ = uVar204;
                auVar225._8_8_ = auVar226._8_8_;
                auVar225._4_4_ = auVar232._8_4_;
                auVar225._0_4_ = uVar231;
                auVar196._4_4_ = uVar184;
                auVar196._0_4_ = uVar217;
                auVar196._8_4_ = uVar184;
                auVar195._8_8_ = auVar196._8_8_;
                auVar195._4_4_ = auVar218._8_4_;
                auVar195._0_4_ = uVar217;
                auVar216._4_4_ = uVar158;
                auVar216._0_4_ = uVar221;
                auVar216._8_4_ = uVar158;
                auVar215._8_8_ = auVar216._8_8_;
                auVar215._4_4_ = auVar222._8_4_;
                auVar215._0_4_ = uVar221;
                auVar128 = pmaddubsw(auVar165,auVar130);
                auVar193 = pmaddubsw(auVar225,auVar130);
                auVar128 = paddsw(auVar128,auVar145);
                auVar193 = paddsw(auVar193,auVar145);
                auVar128 = psraw(auVar128,7);
                auVar193 = psraw(auVar193,7);
                sVar31 = auVar128._0_2_;
                sVar44 = auVar128._2_2_;
                auVar167[1] = (0 < sVar44) * (sVar44 < 0x100) * auVar128[2] - (0xff < sVar44);
                auVar167[0] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[0] - (0xff < sVar31);
                sVar31 = auVar128._4_2_;
                auVar167[2] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[4] - (0xff < sVar31);
                sVar31 = auVar128._6_2_;
                auVar167[3] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[6] - (0xff < sVar31);
                sVar31 = auVar128._8_2_;
                auVar167[4] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[8] - (0xff < sVar31);
                sVar31 = auVar128._10_2_;
                auVar167[5] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[10] - (0xff < sVar31);
                sVar31 = auVar128._12_2_;
                auVar167[6] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[0xc] - (0xff < sVar31);
                sVar31 = auVar128._14_2_;
                auVar167[7] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[0xe] - (0xff < sVar31);
                sVar31 = auVar193._0_2_;
                auVar167[8] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[0] - (0xff < sVar31);
                sVar31 = auVar193._2_2_;
                auVar167[9] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[2] - (0xff < sVar31);
                sVar31 = auVar193._4_2_;
                auVar167[10] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[4] - (0xff < sVar31);
                sVar31 = auVar193._6_2_;
                auVar167[0xb] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[6] - (0xff < sVar31);
                sVar31 = auVar193._8_2_;
                auVar167[0xc] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[8] - (0xff < sVar31);
                sVar31 = auVar193._10_2_;
                auVar167[0xd] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[10] - (0xff < sVar31);
                sVar31 = auVar193._12_2_;
                auVar167[0xe] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[0xc] - (0xff < sVar31);
                sVar31 = auVar193._14_2_;
                auVar167[0xf] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[0xe] - (0xff < sVar31);
                auVar128 = pmaddubsw(auVar195,auVar130);
                auVar193 = pmaddubsw(auVar215,auVar130);
                auVar128 = paddsw(auVar128,auVar145);
                auVar193 = paddsw(auVar193,auVar145);
                auVar128 = psraw(auVar128,7);
                auVar193 = psraw(auVar193,7);
                sVar31 = auVar128._0_2_;
                sVar44 = auVar128._2_2_;
                auVar197[1] = (0 < sVar44) * (sVar44 < 0x100) * auVar128[2] - (0xff < sVar44);
                auVar197[0] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[0] - (0xff < sVar31);
                sVar31 = auVar128._4_2_;
                auVar197[2] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[4] - (0xff < sVar31);
                sVar31 = auVar128._6_2_;
                auVar197[3] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[6] - (0xff < sVar31);
                sVar31 = auVar128._8_2_;
                auVar197[4] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[8] - (0xff < sVar31);
                sVar31 = auVar128._10_2_;
                auVar197[5] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[10] - (0xff < sVar31);
                sVar31 = auVar128._12_2_;
                auVar197[6] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[0xc] - (0xff < sVar31);
                sVar31 = auVar128._14_2_;
                auVar197[7] = (0 < sVar31) * (sVar31 < 0x100) * auVar128[0xe] - (0xff < sVar31);
                sVar31 = auVar193._0_2_;
                auVar197[8] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[0] - (0xff < sVar31);
                sVar31 = auVar193._2_2_;
                auVar197[9] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[2] - (0xff < sVar31);
                sVar31 = auVar193._4_2_;
                auVar197[10] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[4] - (0xff < sVar31);
                sVar31 = auVar193._6_2_;
                auVar197[0xb] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[6] - (0xff < sVar31);
                sVar31 = auVar193._8_2_;
                auVar197[0xc] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[8] - (0xff < sVar31);
                sVar31 = auVar193._10_2_;
                auVar197[0xd] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[10] - (0xff < sVar31);
                sVar31 = auVar193._12_2_;
                auVar197[0xe] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[0xc] - (0xff < sVar31);
                sVar31 = auVar193._14_2_;
                auVar197[0xf] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[0xe] - (0xff < sVar31);
                auVar128 = pmaddubsw(auVar167,auVar130);
                auVar193 = pmaddubsw(auVar197,auVar130);
                auVar128 = paddsw(auVar128,auVar145);
                auVar193 = paddsw(auVar193,auVar145);
                auVar128 = psraw(auVar128,7);
                auVar193 = psraw(auVar193,7);
                sVar31 = auVar128._0_2_;
                sVar44 = auVar128._2_2_;
                sVar32 = auVar128._4_2_;
                sVar33 = auVar128._6_2_;
                sVar34 = auVar128._8_2_;
                sVar35 = auVar128._10_2_;
                sVar36 = auVar128._12_2_;
                sVar37 = auVar128._14_2_;
                sVar38 = auVar193._0_2_;
                sVar39 = auVar193._2_2_;
                sVar40 = auVar193._4_2_;
                sVar41 = auVar193._6_2_;
                sVar42 = auVar193._8_2_;
                sVar43 = auVar193._10_2_;
                sVar45 = auVar193._12_2_;
                sVar46 = auVar193._14_2_;
                puVar1 = puVar91 + lVar108;
                *puVar1 = (0 < sVar31) * (sVar31 < 0x100) * auVar128[0] - (0xff < sVar31);
                puVar1[1] = (0 < sVar44) * (sVar44 < 0x100) * auVar128[2] - (0xff < sVar44);
                puVar1[2] = (0 < sVar32) * (sVar32 < 0x100) * auVar128[4] - (0xff < sVar32);
                puVar1[3] = (0 < sVar33) * (sVar33 < 0x100) * auVar128[6] - (0xff < sVar33);
                puVar1[4] = (0 < sVar34) * (sVar34 < 0x100) * auVar128[8] - (0xff < sVar34);
                puVar1[5] = (0 < sVar35) * (sVar35 < 0x100) * auVar128[10] - (0xff < sVar35);
                puVar1[6] = (0 < sVar36) * (sVar36 < 0x100) * auVar128[0xc] - (0xff < sVar36);
                puVar1[7] = (0 < sVar37) * (sVar37 < 0x100) * auVar128[0xe] - (0xff < sVar37);
                puVar1[8] = (0 < sVar38) * (sVar38 < 0x100) * auVar193[0] - (0xff < sVar38);
                puVar1[9] = (0 < sVar39) * (sVar39 < 0x100) * auVar193[2] - (0xff < sVar39);
                puVar1[10] = (0 < sVar40) * (sVar40 < 0x100) * auVar193[4] - (0xff < sVar40);
                puVar1[0xb] = (0 < sVar41) * (sVar41 < 0x100) * auVar193[6] - (0xff < sVar41);
                puVar1[0xc] = (0 < sVar42) * (sVar42 < 0x100) * auVar193[8] - (0xff < sVar42);
                puVar1[0xd] = (0 < sVar43) * (sVar43 < 0x100) * auVar193[10] - (0xff < sVar43);
                puVar1[0xe] = (0 < sVar45) * (sVar45 < 0x100) * auVar193[0xc] - (0xff < sVar45);
                puVar1[0xf] = (0 < sVar46) * (sVar46 < 0x100) * auVar193[0xe] - (0xff < sVar46);
                lVar108 = lVar108 + 0x10;
                puVar107 = puVar107 + 0x40;
              } while (uVar93 != (uint)lVar108);
              puVar91 = puVar91 + lVar108 + ((long)iVar112 - (long)(int)uVar93);
              iVar110 = iVar110 + -1;
              puVar92 = puVar107;
            } while (iVar110 != 0);
          }
        }
        else {
          if ((iVar105 * 4 == iVar112 * 3) && (iVar115 == iVar117 * 3)) {
            iVar117 = (iVar102 - (iVar102 + 5) % 6) + 7;
            uVar93 = iVar102 + 7U & 0xfffffff8;
            iVar112 = (uVar93 - iVar117) * 2;
            if ((int)uVar93 <= iVar117) {
              iVar112 = 0;
            }
            local_370 = (longlong *)
                        malloc((long)(int)((((int)uVar90 << 2) / 3 + 0xeU & 0xfffffff8) * iVar117 +
                                          iVar112));
            if (local_370 == (longlong *)0x0) {
LAB_0036eef8:
              av1_resize_and_extend_frame_c(src,dst,filter,phase,num_planes);
              return;
            }
            piVar12 = pIVar89->filter_ptr;
            iVar117 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            local_308 = dst->store_buf_adr[uVar116 - 4];
            iVar102 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            iVar94 = (iVar105 + 5) % 6;
            iVar101 = (iVar105 + 5) - iVar94;
            iVar112 = iVar101 * 2 + 4;
            local_390 = iVar115 / 3 + 0xeU & 0xfffffff8;
            puVar91 = src->store_buf_adr[uVar116 - 4];
            auVar145 = *(undefined1 (*) [16])((long)piVar12 + (ulong)((phase & 0xfU) << 4));
            local_c8 = (__m128i)pshufb(auVar145,_DAT_0046b2b0);
            local_a8 = pshufb(auVar145,_DAT_0046b2d0);
            local_98 = pshufb(auVar145,_DAT_0046b2e0);
            (**(code **)(scale_plane_4_to_3_general_shuffle_filter_func_list + uVar4))
                      ((long)piVar12 + (ulong)((uVar88 & 0xf) << 4),f1,
                       (long)iVar115 % 3 & 0xffffffff);
            (**(code **)(scale_plane_4_to_3_general_shuffle_filter_func_list + (ulong)uVar109 * 8))
                      ((long)piVar12 + (ulong)((uVar86 & 0xf) << 4),local_88);
            auVar128 = pshufb(auVar145,_DAT_0046b2c0);
            local_b8 = auVar128[0] + -0x40;
            cStack_b7 = auVar128[1] + -0x40;
            cStack_b6 = auVar128[2] + -0x40;
            cStack_b5 = auVar128[3] + -0x40;
            cStack_b4 = auVar128[4] + -0x40;
            cStack_b3 = auVar128[5] + -0x40;
            cStack_b2 = auVar128[6] + -0x40;
            cStack_b1 = auVar128[7] + -0x40;
            cStack_b0 = auVar128[8] + -0x40;
            cStack_af = auVar128[9] + -0x40;
            cStack_ae = auVar128[10] + -0x40;
            cStack_ad = auVar128[0xb] + -0x40;
            cStack_ac = auVar128[0xc] + -0x40;
            cStack_ab = auVar128[0xd] + -0x40;
            cStack_aa = auVar128[0xe] + -0x40;
            cStack_a9 = auVar128[0xf] + -0x40;
            cVar14 = *(char *)((long)f1[1] + uVar95 + 1);
            cVar62 = *(char *)((long)f1[1] + uVar95 + 2);
            cVar63 = *(char *)((long)f1[1] + uVar95 + 3);
            cVar64 = *(char *)((long)f1[1] + uVar95 + 4);
            cVar65 = *(char *)((long)f1[1] + uVar95 + 5);
            cVar66 = *(char *)((long)f1[1] + uVar95 + 6);
            cVar67 = *(char *)((long)f1[1] + uVar95 + 7);
            cVar68 = *(char *)((long)f1[1] + uVar95 + 8);
            cVar69 = *(char *)((long)f1[1] + uVar95 + 9);
            cVar70 = *(char *)((long)f1[1] + uVar95 + 10);
            cVar71 = *(char *)((long)f1[1] + uVar95 + 0xb);
            cVar72 = *(char *)((long)f1[1] + uVar95 + 0xc);
            cVar73 = *(char *)((long)f1[1] + uVar95 + 0xd);
            cVar74 = *(char *)((long)f1[1] + uVar95 + 0xe);
            cVar75 = *(char *)((long)f1[1] + uVar95 + 0xf);
            *pcVar96 = *pcVar96 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 1) = cVar14 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 2) = cVar62 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 3) = cVar63 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 4) = cVar64 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 5) = cVar65 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 6) = cVar66 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 7) = cVar67 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 8) = cVar68 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 9) = cVar69 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 10) = cVar70 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 0xb) = cVar71 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 0xc) = cVar72 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 0xd) = cVar73 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 0xe) = cVar74 + -0x40;
            *(char *)((long)f1[1] + uVar95 + 0xf) = cVar75 + -0x40;
            acStack_78[uVar97] = acStack_78[uVar97] + -0x40;
            acStack_78[uVar97 + 1] = acStack_78[uVar97 + 1] + -0x40;
            acStack_78[uVar97 + 2] = acStack_78[uVar97 + 2] + -0x40;
            acStack_78[uVar97 + 3] = acStack_78[uVar97 + 3] + -0x40;
            acStack_78[uVar97 + 4] = acStack_78[uVar97 + 4] + -0x40;
            acStack_78[uVar97 + 5] = acStack_78[uVar97 + 5] + -0x40;
            acStack_78[uVar97 + 6] = acStack_78[uVar97 + 6] + -0x40;
            acStack_78[uVar97 + 7] = acStack_78[uVar97 + 7] + -0x40;
            acStack_78[uVar97 + 8] = acStack_78[uVar97 + 8] + -0x40;
            acStack_78[uVar97 + 9] = acStack_78[uVar97 + 9] + -0x40;
            acStack_78[uVar97 + 10] = acStack_78[uVar97 + 10] + -0x40;
            acStack_78[uVar97 + 0xb] = acStack_78[uVar97 + 0xb] + -0x40;
            acStack_78[uVar97 + 0xc] = acStack_78[uVar97 + 0xc] + -0x40;
            acStack_78[uVar97 + 0xd] = acStack_78[uVar97 + 0xd] + -0x40;
            acStack_78[uVar97 + 0xe] = acStack_78[uVar97 + 0xe] + -0x40;
            acStack_78[uVar97 + 0xf] = acStack_78[uVar97 + 0xf] + -0x40;
            local_318 = *(code **)(scale_plane_4_to_3_general_convolve8_func_list + uVar4);
            uStack_310 = auVar145._8_8_;
            lVar108 = (long)iVar112;
            lVar87 = lVar108 * 3;
            plVar114 = local_370;
            puVar91 = puVar91 + (iVar117 * -3 + -3);
            do {
              load_8bit_8x8(puVar91,(long)iVar117,s);
              transpose_16bit_4x8(s,s);
              puVar92 = puVar91 + ((iVar101 * 4) / -3 + iVar117 * 8);
              iVar115 = (iVar94 - iVar105) + -5;
              do {
                puVar91 = puVar91 + 8;
                palVar11 = s + 4;
                load_8bit_8x8(puVar91,(long)iVar117,palVar11);
                transpose_16bit_4x8(palVar11,palVar11);
                alVar235 = convolve8_8_even_offset_ssse3(s,&local_c8);
                uVar124 = (*local_318)(s + ((int)uVar88 >> 5),f1,alVar235[1]);
                pcVar13 = *(code **)(scale_plane_4_to_3_general_convolve8_func_list +
                                    (ulong)uVar109 * 8);
                uVar125 = (*pcVar13)(s + ((int)uVar86 >> 5),local_88);
                alVar235 = convolve8_8_even_offset_ssse3(s + 2,&local_c8);
                uVar126 = (*local_318)(s + (long)((int)uVar88 >> 5) + 2,f1,alVar235[1]);
                uVar127 = (*pcVar13)(s + (long)((int)uVar86 >> 5) + 2,local_88);
                local_388._0_2_ = (short)extraout_XMM0_Qa;
                local_388._2_2_ = (short)((ulong)extraout_XMM0_Qa >> 0x10);
                local_388._4_2_ = (short)((ulong)extraout_XMM0_Qa >> 0x20);
                local_388._6_2_ = (short)((ulong)extraout_XMM0_Qa >> 0x30);
                sStack_380 = (short)extraout_XMM0_Qb;
                sStack_37e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
                sStack_37c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
                sStack_37a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
                local_2e8 = (short)uVar125;
                sStack_2e6 = (short)((ulong)uVar125 >> 0x10);
                sStack_2e4 = (short)((ulong)uVar125 >> 0x20);
                sStack_2e2 = (short)((ulong)uVar125 >> 0x30);
                sStack_2e0 = (short)extraout_XMM0_Qb_01;
                sStack_2de = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
                sStack_2dc = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
                sStack_2da = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
                uVar183 = CONCAT11((0 < local_388._2_2_) * (local_388._2_2_ < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qa >> 0x10) -
                                   (0xff < local_388._2_2_),
                                   (0 < (short)local_388) * ((short)local_388 < 0x100) *
                                   (char)extraout_XMM0_Qa - (0xff < (short)local_388));
                uVar184 = CONCAT13((0 < local_388._6_2_) * (local_388._6_2_ < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qa >> 0x30) -
                                   (0xff < local_388._6_2_),
                                   CONCAT12((0 < local_388._4_2_) * (local_388._4_2_ < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qa >> 0x20) -
                                            (0xff < local_388._4_2_),uVar183));
                uVar185 = CONCAT15((0 < sStack_37e) * (sStack_37e < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb >> 0x10) - (0xff < sStack_37e),
                                   CONCAT14((0 < sStack_380) * (sStack_380 < 0x100) *
                                            (char)extraout_XMM0_Qb - (0xff < sStack_380),uVar184));
                uVar186 = CONCAT17((0 < sStack_37a) * (sStack_37a < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb >> 0x30) - (0xff < sStack_37a),
                                   CONCAT16((0 < sStack_37c) * (sStack_37c < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qb >> 0x20) -
                                            (0xff < sStack_37c),uVar185));
                auVar187._0_10_ =
                     CONCAT19((0 < sStack_2e6) * (sStack_2e6 < 0x100) *
                              (char)((ulong)uVar125 >> 0x10) - (0xff < sStack_2e6),
                              CONCAT18((0 < local_2e8) * (local_2e8 < 0x100) * (char)uVar125 -
                                       (0xff < local_2e8),uVar186));
                auVar187[10] = (0 < sStack_2e4) * (sStack_2e4 < 0x100) *
                               (char)((ulong)uVar125 >> 0x20) - (0xff < sStack_2e4);
                auVar187[0xb] =
                     (0 < sStack_2e2) * (sStack_2e2 < 0x100) * (char)((ulong)uVar125 >> 0x30) -
                     (0xff < sStack_2e2);
                auVar191[0xc] =
                     (0 < sStack_2e0) * (sStack_2e0 < 0x100) * (char)extraout_XMM0_Qb_01 -
                     (0xff < sStack_2e0);
                auVar191._0_12_ = auVar187;
                auVar191[0xd] =
                     (0 < sStack_2de) * (sStack_2de < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_01 >> 0x10) - (0xff < sStack_2de);
                auVar198[0xe] =
                     (0 < sStack_2dc) * (sStack_2dc < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_01 >> 0x20) - (0xff < sStack_2dc);
                auVar198._0_14_ = auVar191;
                auVar198[0xf] =
                     (0 < sStack_2da) * (sStack_2da < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_01 >> 0x30) - (0xff < sStack_2da);
                local_2d8._0_2_ = (short)uVar124;
                local_2d8._2_2_ = (short)((ulong)uVar124 >> 0x10);
                local_2d8._4_2_ = (short)((ulong)uVar124 >> 0x20);
                local_2d8._6_2_ = (short)((ulong)uVar124 >> 0x30);
                sStack_2d0 = (short)extraout_XMM0_Qb_00;
                sStack_2ce = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
                sStack_2cc = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                sStack_2ca = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
                local_328._0_2_ = (short)extraout_XMM0_Qa_00;
                local_328._2_2_ = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
                local_328._4_2_ = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
                local_328._6_2_ = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
                sStack_320 = (short)extraout_XMM0_Qb_02;
                sStack_31e = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
                sStack_31c = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
                sStack_31a = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
                uVar156 = CONCAT11((0 < local_2d8._2_2_) * (local_2d8._2_2_ < 0x100) *
                                   (char)((ulong)uVar124 >> 0x10) - (0xff < local_2d8._2_2_),
                                   (0 < (short)local_2d8) * ((short)local_2d8 < 0x100) *
                                   (char)uVar124 - (0xff < (short)local_2d8));
                uVar158 = CONCAT13((0 < local_2d8._6_2_) * (local_2d8._6_2_ < 0x100) *
                                   (char)((ulong)uVar124 >> 0x30) - (0xff < local_2d8._6_2_),
                                   CONCAT12((0 < local_2d8._4_2_) * (local_2d8._4_2_ < 0x100) *
                                            (char)((ulong)uVar124 >> 0x20) -
                                            (0xff < local_2d8._4_2_),uVar156));
                uVar159 = CONCAT15((0 < sStack_2ce) * (sStack_2ce < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) - (0xff < sStack_2ce),
                                   CONCAT14((0 < sStack_2d0) * (sStack_2d0 < 0x100) *
                                            (char)extraout_XMM0_Qb_00 - (0xff < sStack_2d0),uVar158)
                                  );
                uVar124 = CONCAT17((0 < sStack_2ca) * (sStack_2ca < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_2ca),
                                   CONCAT16((0 < sStack_2cc) * (sStack_2cc < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) -
                                            (0xff < sStack_2cc),uVar159));
                auVar160._0_10_ =
                     CONCAT19((0 < local_328._2_2_) * (local_328._2_2_ < 0x100) *
                              (char)((ulong)extraout_XMM0_Qa_00 >> 0x10) - (0xff < local_328._2_2_),
                              CONCAT18((0 < (short)local_328) * ((short)local_328 < 0x100) *
                                       (char)extraout_XMM0_Qa_00 - (0xff < (short)local_328),uVar124
                                      ));
                auVar160[10] = (0 < local_328._4_2_) * (local_328._4_2_ < 0x100) *
                               (char)((ulong)extraout_XMM0_Qa_00 >> 0x20) - (0xff < local_328._4_2_)
                ;
                auVar160[0xb] =
                     (0 < local_328._6_2_) * (local_328._6_2_ < 0x100) *
                     (char)((ulong)extraout_XMM0_Qa_00 >> 0x30) - (0xff < local_328._6_2_);
                auVar162[0xc] =
                     (0 < sStack_320) * (sStack_320 < 0x100) * (char)extraout_XMM0_Qb_02 -
                     (0xff < sStack_320);
                auVar162._0_12_ = auVar160;
                auVar162[0xd] =
                     (0 < sStack_31e) * (sStack_31e < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_02 >> 0x10) - (0xff < sStack_31e);
                auVar168[0xe] =
                     (0 < sStack_31c) * (sStack_31c < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_02 >> 0x20) - (0xff < sStack_31c);
                auVar168._0_14_ = auVar162;
                auVar168[0xf] =
                     (0 < sStack_31a) * (sStack_31a < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_02 >> 0x30) - (0xff < sStack_31a);
                local_2f8._0_2_ = (short)uVar126;
                local_2f8._2_2_ = (short)((ulong)uVar126 >> 0x10);
                local_2f8._4_2_ = (short)((ulong)uVar126 >> 0x20);
                local_2f8._6_2_ = (short)((ulong)uVar126 >> 0x30);
                sStack_2f0 = (short)extraout_XMM0_Qb_03;
                sStack_2ee = (short)((ulong)extraout_XMM0_Qb_03 >> 0x10);
                sStack_2ec = (short)((ulong)extraout_XMM0_Qb_03 >> 0x20);
                sStack_2ea = (short)((ulong)extraout_XMM0_Qb_03 >> 0x30);
                cVar14 = (char)((ulong)uVar126 >> 0x10);
                uVar202 = CONCAT11((0 < local_2f8._2_2_) * (local_2f8._2_2_ < 0x100) * cVar14 -
                                   (0xff < local_2f8._2_2_),
                                   (0 < (short)local_2f8) * ((short)local_2f8 < 0x100) *
                                   (char)uVar126 - (0xff < (short)local_2f8));
                cVar62 = (char)((ulong)uVar126 >> 0x20);
                cVar63 = (char)((ulong)uVar126 >> 0x30);
                auVar207._0_4_ =
                     CONCAT13((0 < local_2f8._6_2_) * (local_2f8._6_2_ < 0x100) * cVar63 -
                              (0xff < local_2f8._6_2_),
                              CONCAT12((0 < local_2f8._4_2_) * (local_2f8._4_2_ < 0x100) * cVar62 -
                                       (0xff < local_2f8._4_2_),uVar202));
                auVar208._0_6_ =
                     CONCAT15((0 < sStack_2ee) * (sStack_2ee < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_03 >> 0x10) - (0xff < sStack_2ee),
                              CONCAT14((0 < sStack_2f0) * (sStack_2f0 < 0x100) *
                                       (char)extraout_XMM0_Qb_03 - (0xff < sStack_2f0),
                                       auVar207._0_4_));
                auVar209._0_8_ =
                     CONCAT17((0 < sStack_2ea) * (sStack_2ea < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_03 >> 0x30) - (0xff < sStack_2ea),
                              CONCAT16((0 < sStack_2ec) * (sStack_2ec < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_03 >> 0x20) -
                                       (0xff < sStack_2ec),auVar208._0_6_));
                auVar210._0_10_ =
                     CONCAT19((0 < local_2f8._2_2_) * (local_2f8._2_2_ < 0x100) * cVar14 -
                              (0xff < local_2f8._2_2_),
                              CONCAT18((0 < (short)local_2f8) * ((short)local_2f8 < 0x100) *
                                       (char)uVar126 - (0xff < (short)local_2f8),auVar209._0_8_));
                auVar211[10] = (0 < local_2f8._4_2_) * (local_2f8._4_2_ < 0x100) * cVar62 -
                               (0xff < local_2f8._4_2_);
                auVar211._0_10_ = auVar210._0_10_;
                auVar211[0xb] =
                     (0 < local_2f8._6_2_) * (local_2f8._6_2_ < 0x100) * cVar63 -
                     (0xff < local_2f8._6_2_);
                sVar31 = (short)uVar127;
                sVar44 = (short)((ulong)uVar127 >> 0x10);
                uVar119 = CONCAT11((0 < sVar44) * (sVar44 < 0x100) * (char)((ulong)uVar127 >> 0x10)
                                   - (0xff < sVar44),
                                   (0 < sVar31) * (sVar31 < 0x100) * (char)uVar127 - (0xff < sVar31)
                                  );
                sVar31 = (short)((ulong)uVar127 >> 0x20);
                sVar44 = (short)((ulong)uVar127 >> 0x30);
                uVar122 = CONCAT13((0 < sVar44) * (sVar44 < 0x100) * (char)((ulong)uVar127 >> 0x30)
                                   - (0xff < sVar44),
                                   CONCAT12((0 < sVar31) * (sVar31 < 0x100) *
                                            (char)((ulong)uVar127 >> 0x20) - (0xff < sVar31),uVar119
                                           ));
                sVar31 = (short)extraout_XMM0_Qb_04;
                sVar44 = (short)((ulong)extraout_XMM0_Qb_04 >> 0x10);
                uVar123 = CONCAT15((0 < sVar44) * (sVar44 < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb_04 >> 0x10) - (0xff < sVar44),
                                   CONCAT14((0 < sVar31) * (sVar31 < 0x100) *
                                            (char)extraout_XMM0_Qb_04 - (0xff < sVar31),uVar122));
                sVar31 = (short)((ulong)extraout_XMM0_Qb_04 >> 0x20);
                sVar44 = (short)((ulong)extraout_XMM0_Qb_04 >> 0x30);
                auVar211._12_2_ = (short)((ulong)auVar209._0_8_ >> 0x30);
                auVar211._14_2_ =
                     (short)(CONCAT17((0 < sVar44) * (sVar44 < 0x100) *
                                      (char)((ulong)extraout_XMM0_Qb_04 >> 0x30) - (0xff < sVar44),
                                      CONCAT16((0 < sVar31) * (sVar31 < 0x100) *
                                               (char)((ulong)extraout_XMM0_Qb_04 >> 0x20) -
                                               (0xff < sVar31),uVar123)) >> 0x30);
                auVar210._12_4_ = auVar211._12_4_;
                auVar210._10_2_ = (short)((uint6)uVar123 >> 0x20);
                auVar209._10_6_ = auVar210._10_6_;
                auVar209._8_2_ = (short)((uint6)auVar208._0_6_ >> 0x20);
                auVar208._8_8_ = auVar209._8_8_;
                auVar208._6_2_ = (short)((uint)uVar122 >> 0x10);
                auVar207._6_10_ = auVar208._6_10_;
                auVar207._4_2_ = (short)((uint)auVar207._0_4_ >> 0x10);
                uVar204 = CONCAT22(uVar119,uVar202);
                auVar136._12_2_ = (short)((ulong)uVar186 >> 0x30);
                auVar136._0_12_ = auVar187;
                auVar136._14_2_ = (short)((ulong)uVar124 >> 0x30);
                auVar135._12_4_ = auVar136._12_4_;
                auVar135._10_2_ = (short)((uint6)uVar159 >> 0x20);
                auVar135._0_10_ = auVar187._0_10_;
                auVar134._10_6_ = auVar135._10_6_;
                auVar134._8_2_ = (short)((uint6)uVar185 >> 0x20);
                auVar134._0_8_ = uVar186;
                auVar133._8_8_ = auVar134._8_8_;
                auVar133._6_2_ = (short)((uint)uVar158 >> 0x10);
                auVar133._0_6_ = uVar185;
                auVar132._6_10_ = auVar133._6_10_;
                auVar132._4_2_ = (short)((uint)uVar184 >> 0x10);
                auVar132._0_4_ = uVar184;
                auVar131._4_12_ = auVar132._4_12_;
                auVar131._0_4_ = CONCAT22(uVar156,uVar183);
                uVar122 = CONCAT22((short)((unkuint10)auVar160._0_10_ >> 0x40),
                                   (short)((unkuint10)auVar187._0_10_ >> 0x40));
                auVar188._0_8_ = CONCAT26(auVar160._10_2_,CONCAT24(auVar187._10_2_,uVar122));
                auVar188._8_2_ = auVar191._12_2_;
                auVar188._10_2_ = auVar162._12_2_;
                auVar199._12_2_ = auVar198._14_2_;
                auVar199._0_12_ = auVar188;
                auVar199._14_2_ = auVar168._14_2_;
                auVar169._0_8_ = auVar131._0_8_;
                auVar169._8_4_ = auVar132._4_4_;
                auVar169._12_4_ = (int)((ulong)auVar188._0_8_ >> 0x20);
                *plVar114 = CONCAT44(uVar122,auVar131._0_4_);
                *(undefined4 *)(plVar114 + 1) = uVar204;
                *(undefined4 *)((long)plVar114 + 0xc) = uVar204;
                puVar107 = (uint8_t *)((long)plVar114 + lVar108);
                *(long *)puVar107 = auVar169._8_8_;
                *(int *)(puVar107 + 0x10) = auVar207._4_4_;
                *(int *)(puVar107 + 0x14) = auVar207._4_4_;
                puVar107 = (uint8_t *)((long)plVar114 + lVar108 * 2);
                *(int *)puVar107 = auVar134._8_4_;
                *(int *)(puVar107 + 4) = auVar188._8_4_;
                *(int *)(puVar107 + 8) = auVar209._8_4_;
                *(int *)(puVar107 + 0xc) = auVar209._8_4_;
                *(undefined4 *)((long)plVar114 + lVar87 + 8) = auVar135._12_4_;
                *(int *)((long)plVar114 + lVar87 + 0xc) = auVar199._12_4_;
                *(undefined4 *)((long)plVar114 + lVar87 + 0x10) = auVar210._12_4_;
                *(undefined4 *)((long)plVar114 + lVar87 + 0x14) = auVar210._12_4_;
                s[0][0] = s[4][0];
                s[0][1] = s[4][1];
                s[1][0] = s[5][0];
                s[1][1] = s[5][1];
                s[2][0] = s[6][0];
                s[2][1] = s[6][1];
                s[3][0] = s[7][0];
                s[3][1] = s[7][1];
                plVar114 = (longlong *)((long)plVar114 + 0xc);
                puVar92 = puVar92 + 8;
                iVar115 = iVar115 + 6;
              } while (iVar115 != 0);
              plVar114 = (longlong *)((long)plVar114 + (long)(iVar112 * 3) + 4);
              local_390 = local_390 - 8;
              puVar91 = puVar92;
            } while (local_390 != 0);
            iVar117 = (iVar110 + 5) % 6;
            uVar93 = iVar105 + 7U & 0xfffffff8;
            iVar105 = (iVar110 + 5) - iVar117;
            plVar114 = local_370;
            do {
              s[0][0] = *plVar114;
              s[0][1] = plVar114[1];
              s[1][0] = *(longlong *)((long)plVar114 + lVar108);
              s[1][1] = ((longlong *)((long)plVar114 + lVar108))[1];
              plVar3 = (longlong *)((long)plVar114 + lVar108 * 2);
              s[2][0] = *plVar3;
              s[2][1] = plVar3[1];
              s[3][0] = *(longlong *)((long)plVar114 + lVar87);
              s[3][1] = ((longlong *)((long)plVar114 + lVar87))[1];
              iVar115 = (iVar117 - iVar110) + -5;
              do {
                plVar3 = (longlong *)((long)plVar114 + lVar108 * 4);
                s[4][0] = *plVar3;
                s[4][1] = plVar3[1];
                plVar3 = (longlong *)((long)plVar114 + lVar108 * 5);
                s[5][0] = *plVar3;
                s[5][1] = plVar3[1];
                plVar3 = (longlong *)((long)plVar114 + lVar108 * 6);
                s[6][0] = *plVar3;
                s[6][1] = plVar3[1];
                plVar3 = (longlong *)((long)plVar114 + lVar108 * 7);
                s[7][0] = *plVar3;
                s[7][1] = plVar3[1];
                plVar114 = (longlong *)((long)plVar114 + lVar108 * 4);
                alVar235 = convolve8_8_even_offset_ssse3(s,&local_c8);
                uVar124 = (*local_318)(s + ((int)uVar88 >> 5),f1,alVar235[1]);
                uVar125 = (*pcVar13)(s + ((int)uVar86 >> 5),local_88);
                alVar235 = convolve8_8_even_offset_ssse3(s + 2,&local_c8);
                uVar126 = (*local_318)(s + (long)((int)uVar88 >> 5) + 2,f1,alVar235[1]);
                uVar127 = (*pcVar13)(s + (long)((int)uVar86 >> 5) + 2,local_88);
                local_388._0_2_ = (short)extraout_XMM0_Qa_01;
                local_388._2_2_ = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
                local_388._4_2_ = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
                local_388._6_2_ = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
                sStack_380 = (short)extraout_XMM0_Qb_05;
                sStack_37e = (short)((ulong)extraout_XMM0_Qb_05 >> 0x10);
                sStack_37c = (short)((ulong)extraout_XMM0_Qb_05 >> 0x20);
                sStack_37a = (short)((ulong)extraout_XMM0_Qb_05 >> 0x30);
                local_328._0_2_ = (short)uVar125;
                local_328._2_2_ = (short)((ulong)uVar125 >> 0x10);
                local_328._4_2_ = (short)((ulong)uVar125 >> 0x20);
                local_328._6_2_ = (short)((ulong)uVar125 >> 0x30);
                sStack_320 = (short)extraout_XMM0_Qb_07;
                sStack_31e = (short)((ulong)extraout_XMM0_Qb_07 >> 0x10);
                sStack_31c = (short)((ulong)extraout_XMM0_Qb_07 >> 0x20);
                sStack_31a = (short)((ulong)extraout_XMM0_Qb_07 >> 0x30);
                local_2f8._0_2_ = (short)uVar126;
                local_2f8._2_2_ = (short)((ulong)uVar126 >> 0x10);
                local_2f8._4_2_ = (short)((ulong)uVar126 >> 0x20);
                local_2f8._6_2_ = (short)((ulong)uVar126 >> 0x30);
                sStack_2f0 = (short)extraout_XMM0_Qb_09;
                sStack_2ee = (short)((ulong)extraout_XMM0_Qb_09 >> 0x10);
                sStack_2ec = (short)((ulong)extraout_XMM0_Qb_09 >> 0x20);
                sStack_2ea = (short)((ulong)extraout_XMM0_Qb_09 >> 0x30);
                *(ulong *)local_308 =
                     CONCAT17((0 < sStack_37a) * (sStack_37a < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_05 >> 0x30) - (0xff < sStack_37a),
                              CONCAT16((0 < sStack_37c) * (sStack_37c < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_05 >> 0x20) -
                                       (0xff < sStack_37c),
                                       CONCAT15((0 < sStack_37e) * (sStack_37e < 0x100) *
                                                (char)((ulong)extraout_XMM0_Qb_05 >> 0x10) -
                                                (0xff < sStack_37e),
                                                CONCAT14((0 < sStack_380) * (sStack_380 < 0x100) *
                                                         (char)extraout_XMM0_Qb_05 -
                                                         (0xff < sStack_380),
                                                         CONCAT13((0 < local_388._6_2_) *
                                                                  (local_388._6_2_ < 0x100) *
                                                                  (char)((ulong)extraout_XMM0_Qa_01
                                                                        >> 0x30) -
                                                                  (0xff < local_388._6_2_),
                                                                  CONCAT12((0 < local_388._4_2_) *
                                                                           (local_388._4_2_ < 0x100)
                                                                           * (char)((ulong)
                                                  extraout_XMM0_Qa_01 >> 0x20) -
                                                  (0xff < local_388._4_2_),
                                                  CONCAT11((0 < local_388._2_2_) *
                                                           (local_388._2_2_ < 0x100) *
                                                           (char)((ulong)extraout_XMM0_Qa_01 >> 0x10
                                                                 ) - (0xff < local_388._2_2_),
                                                           (0 < (short)local_388) *
                                                           ((short)local_388 < 0x100) *
                                                           (char)extraout_XMM0_Qa_01 -
                                                           (0xff < (short)local_388))))))));
                local_2d8._0_2_ = (short)uVar124;
                local_2d8._2_2_ = (short)((ulong)uVar124 >> 0x10);
                local_2d8._4_2_ = (short)((ulong)uVar124 >> 0x20);
                local_2d8._6_2_ = (short)((ulong)uVar124 >> 0x30);
                sStack_2d0 = (short)extraout_XMM0_Qb_06;
                sStack_2ce = (short)((ulong)extraout_XMM0_Qb_06 >> 0x10);
                sStack_2cc = (short)((ulong)extraout_XMM0_Qb_06 >> 0x20);
                sStack_2ca = (short)((ulong)extraout_XMM0_Qb_06 >> 0x30);
                *(ulong *)(local_308 + iVar102) =
                     CONCAT17((0 < sStack_2ca) * (sStack_2ca < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_06 >> 0x30) - (0xff < sStack_2ca),
                              CONCAT16((0 < sStack_2cc) * (sStack_2cc < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_06 >> 0x20) -
                                       (0xff < sStack_2cc),
                                       CONCAT15((0 < sStack_2ce) * (sStack_2ce < 0x100) *
                                                (char)((ulong)extraout_XMM0_Qb_06 >> 0x10) -
                                                (0xff < sStack_2ce),
                                                CONCAT14((0 < sStack_2d0) * (sStack_2d0 < 0x100) *
                                                         (char)extraout_XMM0_Qb_06 -
                                                         (0xff < sStack_2d0),
                                                         CONCAT13((0 < local_2d8._6_2_) *
                                                                  (local_2d8._6_2_ < 0x100) *
                                                                  (char)((ulong)uVar124 >> 0x30) -
                                                                  (0xff < local_2d8._6_2_),
                                                                  CONCAT12((0 < local_2d8._4_2_) *
                                                                           (local_2d8._4_2_ < 0x100)
                                                                           * (char)((ulong)uVar124
                                                                                   >> 0x20) -
                                                                           (0xff < local_2d8._4_2_),
                                                                           CONCAT11((0 < local_2d8.
                                                                                         _2_2_) *
                                                                                    (local_2d8._2_2_
                                                                                    < 0x100) *
                                                                                    (char)((ulong)
                                                  uVar124 >> 0x10) - (0xff < local_2d8._2_2_),
                                                  (0 < (short)local_2d8) *
                                                  ((short)local_2d8 < 0x100) * (char)uVar124 -
                                                  (0xff < (short)local_2d8))))))));
                *(ulong *)(local_308 + iVar102 * 2) =
                     CONCAT17((0 < sStack_31a) * (sStack_31a < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_07 >> 0x30) - (0xff < sStack_31a),
                              CONCAT16((0 < sStack_31c) * (sStack_31c < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_07 >> 0x20) -
                                       (0xff < sStack_31c),
                                       CONCAT15((0 < sStack_31e) * (sStack_31e < 0x100) *
                                                (char)((ulong)extraout_XMM0_Qb_07 >> 0x10) -
                                                (0xff < sStack_31e),
                                                CONCAT14((0 < sStack_320) * (sStack_320 < 0x100) *
                                                         (char)extraout_XMM0_Qb_07 -
                                                         (0xff < sStack_320),
                                                         CONCAT13((0 < local_328._6_2_) *
                                                                  (local_328._6_2_ < 0x100) *
                                                                  (char)((ulong)uVar125 >> 0x30) -
                                                                  (0xff < local_328._6_2_),
                                                                  CONCAT12((0 < local_328._4_2_) *
                                                                           (local_328._4_2_ < 0x100)
                                                                           * (char)((ulong)uVar125
                                                                                   >> 0x20) -
                                                                           (0xff < local_328._4_2_),
                                                                           CONCAT11((0 < local_328.
                                                                                         _2_2_) *
                                                                                    (local_328._2_2_
                                                                                    < 0x100) *
                                                                                    (char)((ulong)
                                                  uVar125 >> 0x10) - (0xff < local_328._2_2_),
                                                  (0 < (short)local_328) *
                                                  ((short)local_328 < 0x100) * (char)uVar125 -
                                                  (0xff < (short)local_328))))))));
                local_2e8 = (short)extraout_XMM0_Qa_02;
                sStack_2e6 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
                sStack_2e4 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
                sStack_2e2 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
                sStack_2e0 = (short)extraout_XMM0_Qb_08;
                sStack_2de = (short)((ulong)extraout_XMM0_Qb_08 >> 0x10);
                sStack_2dc = (short)((ulong)extraout_XMM0_Qb_08 >> 0x20);
                sStack_2da = (short)((ulong)extraout_XMM0_Qb_08 >> 0x30);
                *(ulong *)(local_308 + iVar102 * 3) =
                     CONCAT17((0 < sStack_2da) * (sStack_2da < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_08 >> 0x30) - (0xff < sStack_2da),
                              CONCAT16((0 < sStack_2dc) * (sStack_2dc < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_08 >> 0x20) -
                                       (0xff < sStack_2dc),
                                       CONCAT15((0 < sStack_2de) * (sStack_2de < 0x100) *
                                                (char)((ulong)extraout_XMM0_Qb_08 >> 0x10) -
                                                (0xff < sStack_2de),
                                                CONCAT14((0 < sStack_2e0) * (sStack_2e0 < 0x100) *
                                                         (char)extraout_XMM0_Qb_08 -
                                                         (0xff < sStack_2e0),
                                                         CONCAT13((0 < sStack_2e2) *
                                                                  (sStack_2e2 < 0x100) *
                                                                  (char)((ulong)extraout_XMM0_Qa_02
                                                                        >> 0x30) -
                                                                  (0xff < sStack_2e2),
                                                                  CONCAT12((0 < sStack_2e4) *
                                                                           (sStack_2e4 < 0x100) *
                                                                           (char)((ulong)
                                                  extraout_XMM0_Qa_02 >> 0x20) - (0xff < sStack_2e4)
                                                  ,CONCAT11((0 < sStack_2e6) * (sStack_2e6 < 0x100)
                                                            * (char)((ulong)extraout_XMM0_Qa_02 >>
                                                                    0x10) - (0xff < sStack_2e6),
                                                            (0 < local_2e8) * (local_2e8 < 0x100) *
                                                            (char)extraout_XMM0_Qa_02 -
                                                            (0xff < local_2e8))))))));
                *(ulong *)(local_308 + iVar102 * 4) =
                     CONCAT17((0 < sStack_2ea) * (sStack_2ea < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_09 >> 0x30) - (0xff < sStack_2ea),
                              CONCAT16((0 < sStack_2ec) * (sStack_2ec < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_09 >> 0x20) -
                                       (0xff < sStack_2ec),
                                       CONCAT15((0 < sStack_2ee) * (sStack_2ee < 0x100) *
                                                (char)((ulong)extraout_XMM0_Qb_09 >> 0x10) -
                                                (0xff < sStack_2ee),
                                                CONCAT14((0 < sStack_2f0) * (sStack_2f0 < 0x100) *
                                                         (char)extraout_XMM0_Qb_09 -
                                                         (0xff < sStack_2f0),
                                                         CONCAT13((0 < local_2f8._6_2_) *
                                                                  (local_2f8._6_2_ < 0x100) *
                                                                  (char)((ulong)uVar126 >> 0x30) -
                                                                  (0xff < local_2f8._6_2_),
                                                                  CONCAT12((0 < local_2f8._4_2_) *
                                                                           (local_2f8._4_2_ < 0x100)
                                                                           * (char)((ulong)uVar126
                                                                                   >> 0x20) -
                                                                           (0xff < local_2f8._4_2_),
                                                                           CONCAT11((0 < local_2f8.
                                                                                         _2_2_) *
                                                                                    (local_2f8._2_2_
                                                                                    < 0x100) *
                                                                                    (char)((ulong)
                                                  uVar126 >> 0x10) - (0xff < local_2f8._2_2_),
                                                  (0 < (short)local_2f8) *
                                                  ((short)local_2f8 < 0x100) * (char)uVar126 -
                                                  (0xff < (short)local_2f8))))))));
                sVar31 = (short)uVar127;
                sVar44 = (short)((ulong)uVar127 >> 0x10);
                sVar32 = (short)((ulong)uVar127 >> 0x20);
                sVar33 = (short)((ulong)uVar127 >> 0x30);
                sVar34 = (short)extraout_XMM0_Qb_10;
                sVar35 = (short)((ulong)extraout_XMM0_Qb_10 >> 0x10);
                sVar36 = (short)((ulong)extraout_XMM0_Qb_10 >> 0x20);
                sVar37 = (short)((ulong)extraout_XMM0_Qb_10 >> 0x30);
                *(ulong *)(local_308 + iVar102 * 5) =
                     CONCAT17((0 < sVar37) * (sVar37 < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_10 >> 0x30) - (0xff < sVar37),
                              CONCAT16((0 < sVar36) * (sVar36 < 0x100) *
                                       (char)((ulong)extraout_XMM0_Qb_10 >> 0x20) - (0xff < sVar36),
                                       CONCAT15((0 < sVar35) * (sVar35 < 0x100) *
                                                (char)((ulong)extraout_XMM0_Qb_10 >> 0x10) -
                                                (0xff < sVar35),
                                                CONCAT14((0 < sVar34) * (sVar34 < 0x100) *
                                                         (char)extraout_XMM0_Qb_10 - (0xff < sVar34)
                                                         ,CONCAT13((0 < sVar33) * (sVar33 < 0x100) *
                                                                   (char)((ulong)uVar127 >> 0x30) -
                                                                   (0xff < sVar33),
                                                                   CONCAT12((0 < sVar32) *
                                                                            (sVar32 < 0x100) *
                                                                            (char)((ulong)uVar127 >>
                                                                                  0x20) -
                                                                            (0xff < sVar32),
                                                                            CONCAT11((0 < sVar44) *
                                                                                     (sVar44 < 0x100
                                                                                     ) * (char)((
                                                  ulong)uVar127 >> 0x10) - (0xff < sVar44),
                                                  (0 < sVar31) * (sVar31 < 0x100) * (char)uVar127 -
                                                  (0xff < sVar31))))))));
                s[0][0] = s[4][0];
                s[0][1] = s[4][1];
                s[1][0] = s[5][0];
                s[1][1] = s[5][1];
                s[2][0] = s[6][0];
                s[2][1] = s[6][1];
                s[3][0] = s[7][0];
                s[3][1] = s[7][1];
                local_308 = local_308 + (long)iVar102 * 6;
                iVar115 = iVar115 + 6;
              } while (iVar115 != 0);
              plVar114 = (longlong *)((long)plVar114 + (long)((iVar112 * iVar105 * 2) / -3) + 0x10);
              local_308 = local_308 + (8 - (long)(iVar105 * iVar102));
              uVar93 = uVar93 - 8;
            } while (uVar93 != 0);
          }
          else {
            local_370 = (longlong *)
                        malloc((long)(int)(((src->field_2).field_0.y_crop_width * 8 + 8U &
                                           0xfffffff0) + 0x38 & 0xffffffc0));
            if (local_370 == (longlong *)0x0) goto LAB_0036eef8;
            puVar91 = src->store_buf_adr[uVar116 - 4];
            lVar108 = (long)*(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28))
            ;
            local_398 = dst->store_buf_adr[uVar116 - 4];
            lVar87 = (long)*(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar118 * 4) - 0x28));
            uVar90 = (long)iVar112 + 7U & 0xfffffffffffffff8;
            local_388 = (longlong *)((long)local_370 + uVar90);
            iVar105 = (int)uVar90;
            local_328 = (longlong *)((long)(iVar105 * 2) + (long)local_370);
            local_2d8 = (longlong *)((long)(iVar105 * 3) + (long)local_370);
            plVar114 = (longlong *)((long)(iVar105 * 4) + (long)local_370);
            local_318 = (code *)((long)(iVar105 * 5) + (long)local_370);
            local_358 = (longlong *)((long)(iVar105 * 6) + (long)local_370);
            auVar145 = *(undefined1 (*) [16])(pIVar89->filter_ptr + 0x40);
            f1[0] = (__m128i)pshufb(auVar145,_DAT_0046b2b0);
            f1[1] = (__m128i)pshufb(auVar145,_DAT_0046b2c0);
            f1[2] = (__m128i)pshufb(auVar145,_DAT_0046b2d0);
            f1[3] = (__m128i)pshufb(auVar145,_DAT_0046b2e0);
            local_330 = puVar91 + lVar108 * -3;
            uVar93 = (uint)((long)iVar112 + 7U);
            scale_1_to_2_phase_0_row(local_330 + -3,(uint8_t *)local_370,uVar93 & 0xfffffff8,f1);
            scale_1_to_2_phase_0_row
                      (puVar91 + lVar108 * -2 + -3,(uint8_t *)local_388,uVar93 & 0xfffffff8,f1);
            scale_1_to_2_phase_0_row
                      (puVar91 + -3 + -lVar108,(uint8_t *)local_328,uVar93 & 0xfffffff8,f1);
            scale_1_to_2_phase_0_row(puVar91 + -3,(uint8_t *)local_2d8,uVar93 & 0xfffffff8,f1);
            scale_1_to_2_phase_0_row
                      (puVar91 + lVar108 + -3,(uint8_t *)plVar114,uVar93 & 0xfffffff8,f1);
            scale_1_to_2_phase_0_row
                      (puVar91 + lVar108 * 2 + -3,(uint8_t *)local_318,uVar93 & 0xfffffff8,f1);
            scale_1_to_2_phase_0_row
                      (puVar91 + lVar108 * 3 + -3,(uint8_t *)local_358,uVar93 & 0xfffffff8,f1);
            local_338 = local_398 + lVar87;
            lVar87 = lVar87 * 2;
            plVar3 = (longlong *)((long)(iVar105 * 7) + (long)local_370);
            local_2f8 = local_370;
            do {
              plVar113 = plVar114;
              dst_00 = plVar3;
              plVar3 = local_2f8;
              plVar84 = local_328;
              plVar83 = local_388;
              local_2f8 = local_388;
              local_388 = local_328;
              local_328 = local_2d8;
              scale_1_to_2_phase_0_row(puVar91 + lVar108 * 4 + -3,(uint8_t *)dst_00,iVar105,f1);
              for (lVar100 = 0; plVar114 = (longlong *)local_318, lVar100 < (long)uVar90;
                  lVar100 = lVar100 + 8) {
                uVar99 = *(ulong *)(puVar91 + lVar100);
                uVar124 = *(undefined8 *)((long)local_2d8 + lVar100);
                auVar145._8_6_ = 0;
                auVar145._0_8_ = uVar99;
                auVar145[0xe] = (char)(uVar99 >> 0x38);
                auVar145[0xf] = (char)((ulong)uVar124 >> 0x38);
                auVar144._14_2_ = auVar145._14_2_;
                auVar144._8_5_ = 0;
                auVar144._0_8_ = uVar99;
                auVar144[0xd] = (char)((ulong)uVar124 >> 0x30);
                auVar143._13_3_ = auVar144._13_3_;
                auVar143._8_4_ = 0;
                auVar143._0_8_ = uVar99;
                auVar143[0xc] = (char)(uVar99 >> 0x30);
                auVar142._12_4_ = auVar143._12_4_;
                auVar142._8_3_ = 0;
                auVar142._0_8_ = uVar99;
                auVar142[0xb] = (char)((ulong)uVar124 >> 0x28);
                auVar205._11_5_ = auVar142._11_5_;
                auVar205._8_2_ = 0;
                auVar205._0_8_ = uVar99;
                auVar205[10] = (char)(uVar99 >> 0x28);
                auVar194._10_6_ = auVar205._10_6_;
                auVar194[8] = 0;
                auVar194._0_8_ = uVar99;
                auVar194[9] = (char)((ulong)uVar124 >> 0x20);
                auVar193._9_7_ = auVar194._9_7_;
                auVar193[8] = (char)(uVar99 >> 0x20);
                auVar193._0_8_ = uVar99;
                auVar128._8_8_ = auVar193._8_8_;
                auVar128[7] = (char)((ulong)uVar124 >> 0x18);
                auVar128[6] = (char)(uVar99 >> 0x18);
                auVar128[5] = (char)((ulong)uVar124 >> 0x10);
                auVar128[4] = (char)(uVar99 >> 0x10);
                auVar128[3] = (char)((ulong)uVar124 >> 8);
                auVar128[2] = (char)(uVar99 >> 8);
                auVar128[0] = (undefined1)uVar99;
                auVar128[1] = (char)uVar124;
                *(undefined1 (*) [16])(local_398 + lVar100 * 2) = auVar128;
                load_8bit_8x8(local_330 + lVar100,lVar108,s);
                scale_1_to_2_phase_0_kernel(s,f1);
                s[0][0] = *(longlong *)((long)plVar3 + lVar100);
                s[0][1] = 0;
                s[1][0] = *(longlong *)((long)plVar83 + lVar100);
                s[1][1] = 0;
                s[2][0] = *(longlong *)((long)plVar84 + lVar100);
                s[2][1] = 0;
                s[3][0] = *(longlong *)((long)local_2d8 + lVar100);
                s[3][1] = 0;
                s[4][0] = *(longlong *)((long)plVar113 + lVar100);
                s[4][1] = 0;
                s[5][0] = *(longlong *)((long)local_318 + lVar100);
                s[5][1] = 0;
                s[6][0] = *(longlong *)((long)local_358 + lVar100);
                s[6][1] = 0;
                s[7][0] = *(longlong *)((long)dst_00 + lVar100);
                s[7][1] = 0;
                scale_1_to_2_phase_0_kernel(s,f1);
                local_308._0_1_ = (uint8_t)extraout_XMM0_Qa_09;
                local_308._1_1_ = (uint8_t)((ulong)extraout_XMM0_Qa_09 >> 8);
                local_308._2_1_ = (uint8_t)((ulong)extraout_XMM0_Qa_09 >> 0x10);
                local_308._3_1_ = (uint8_t)((ulong)extraout_XMM0_Qa_09 >> 0x18);
                local_308._4_1_ = (uint8_t)((ulong)extraout_XMM0_Qa_09 >> 0x20);
                local_308._5_1_ = (uint8_t)((ulong)extraout_XMM0_Qa_09 >> 0x28);
                local_308._6_1_ = (uint8_t)((ulong)extraout_XMM0_Qa_09 >> 0x30);
                local_308._7_1_ = (uint8_t)((ulong)extraout_XMM0_Qa_09 >> 0x38);
                puVar92 = local_338 + lVar100 * 2;
                *puVar92 = (uint8_t)local_308;
                puVar92[1] = (uint8_t)extraout_XMM0_Qa_10;
                puVar92[2] = local_308._1_1_;
                puVar92[3] = (uint8_t)((ulong)extraout_XMM0_Qa_10 >> 8);
                puVar92[4] = local_308._2_1_;
                puVar92[5] = (uint8_t)((ulong)extraout_XMM0_Qa_10 >> 0x10);
                puVar92[6] = local_308._3_1_;
                puVar92[7] = (uint8_t)((ulong)extraout_XMM0_Qa_10 >> 0x18);
                puVar92[8] = local_308._4_1_;
                puVar92[9] = (uint8_t)((ulong)extraout_XMM0_Qa_10 >> 0x20);
                puVar92[10] = local_308._5_1_;
                puVar92[0xb] = (uint8_t)((ulong)extraout_XMM0_Qa_10 >> 0x28);
                puVar92[0xc] = local_308._6_1_;
                puVar92[0xd] = (uint8_t)((ulong)extraout_XMM0_Qa_10 >> 0x30);
                puVar92[0xe] = local_308._7_1_;
                puVar92[0xf] = (uint8_t)((ulong)extraout_XMM0_Qa_10 >> 0x38);
              }
              puVar91 = puVar91 + lVar108;
              local_398 = local_398 + lVar87;
              local_338 = local_338 + lVar87;
              local_330 = local_330 + lVar108;
              local_318 = (code *)local_358;
              iVar117 = iVar117 + -1;
              local_358 = dst_00;
              local_2d8 = plVar113;
            } while (iVar117 != 0);
          }
LAB_0036ee77:
          free(local_370);
          auVar145 = _DAT_0046b270;
        }
      }
      uVar116 = uVar116 + 1;
    } while( true );
  }
LAB_0036eec1:
  av1_resize_and_extend_frame_c(src,dst,filter,phase,num_planes);
  return;
}

Assistant:

void av1_resize_and_extend_frame_ssse3(const YV12_BUFFER_CONFIG *src,
                                       YV12_BUFFER_CONFIG *dst,
                                       const InterpFilter filter,
                                       const int phase, const int num_planes) {
  bool has_normative_scaler =
      has_normative_scaler_ssse3(src->y_crop_width, src->y_crop_height,
                                 dst->y_crop_width, dst->y_crop_height);

  if (num_planes > 1) {
    has_normative_scaler =
        has_normative_scaler &&
        has_normative_scaler_ssse3(src->uv_crop_width, src->uv_crop_height,
                                   dst->uv_crop_width, dst->uv_crop_height);
  }

  if (!has_normative_scaler) {
    av1_resize_and_extend_frame_c(src, dst, filter, phase, num_planes);
    return;
  }

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  int malloc_failed = 0;
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
    const int src_w = src->crop_widths[is_uv];
    const int src_h = src->crop_heights[is_uv];
    const int src_y_w = (src->crop_widths[0] + 1) & ~1;
    const int dst_w = dst->crop_widths[is_uv];
    const int dst_h = dst->crop_heights[is_uv];
    const int dst_y_w = (dst->crop_widths[0] + 1) & ~1;
    const int dst_y_h = (dst->crop_heights[0] + 1) & ~1;

    if (2 * dst_w == src_w && 2 * dst_h == src_h) {
      // 2 to 1
      if (phase == 0) {
        scale_plane_2_to_1_phase_0(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h);
      } else if (filter == BILINEAR) {
        const int16_t c0 = av1_bilinear_filters[phase][3];
        const int16_t c1 = av1_bilinear_filters[phase][4];
        const __m128i c0c1 = _mm_set1_epi16(c0 | (c1 << 8));  // c0 and c1 >= 0
        scale_plane_2_to_1_bilinear(src->buffers[i], src->strides[is_uv],
                                    dst->buffers[i], dst->strides[is_uv], dst_w,
                                    dst_h, c0c1);
      } else {
        const int buffer_stride = (dst_y_w + 3) & ~3;
        const int buffer_height = (2 * dst_y_h + SUBPEL_TAPS - 2 + 7) & ~7;
        uint8_t *const temp_buffer =
            (uint8_t *)malloc(buffer_stride * buffer_height);
        if (!temp_buffer) {
          malloc_failed = 1;
          break;
        }
        const InterpKernel *interp_kernel =
            (const InterpKernel *)av1_interp_filter_params_list[filter]
                .filter_ptr;
        scale_plane_2_to_1_general(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h, interp_kernel[phase], temp_buffer);
        free(temp_buffer);
      }
    } else if (4 * dst_w == src_w && 4 * dst_h == src_h) {
      // 4 to 1
      if (phase == 0) {
        scale_plane_4_to_1_phase_0(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h);
      } else if (filter == BILINEAR) {
        const int16_t c0 = av1_bilinear_filters[phase][3];
        const int16_t c1 = av1_bilinear_filters[phase][4];
        const __m128i c0c1 = _mm_set1_epi16(c0 | (c1 << 8));  // c0 and c1 >= 0
        scale_plane_4_to_1_bilinear(src->buffers[i], src->strides[is_uv],
                                    dst->buffers[i], dst->strides[is_uv], dst_w,
                                    dst_h, c0c1);
      } else {
        const int buffer_stride = (dst_y_w + 1) & ~1;
        const int buffer_height = (4 * dst_y_h + SUBPEL_TAPS - 2 + 7) & ~7;
        // When dst_w is 1 or 2, we need extra padding to avoid heap read
        // overflow
        const int extra_padding = 16;
        uint8_t *const temp_buffer =
            (uint8_t *)malloc(buffer_stride * buffer_height + extra_padding);
        if (!temp_buffer) {
          malloc_failed = 1;
          break;
        }
        const InterpKernel *interp_kernel =
            (const InterpKernel *)av1_interp_filter_params_list[filter]
                .filter_ptr;
        scale_plane_4_to_1_general(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h, interp_kernel[phase], temp_buffer);
        free(temp_buffer);
      }
    } else if (4 * dst_w == 3 * src_w && 4 * dst_h == 3 * src_h) {
      // 4 to 3
      const int buffer_stride_hor = (dst_y_w + 5) - ((dst_y_w + 5) % 6) + 2;
      const int buffer_stride_ver = (dst_y_w + 7) & ~7;
      const int buffer_height = (4 * dst_y_h / 3 + SUBPEL_TAPS - 1 + 7) & ~7;
      // When the vertical filter reads more pixels than the horizontal filter
      // generated in each row, we need extra padding to avoid heap read
      // overflow. For example, the horizontal filter generates 18 pixels but
      // the vertical filter reads 24 pixels in a row. The difference is
      // multiplied by 2 since two rows are interlaced together in the
      // optimization.
      const int extra_padding =
          (buffer_stride_ver > buffer_stride_hor)
              ? 2 * (buffer_stride_ver - buffer_stride_hor)
              : 0;
      const int buffer_size = buffer_stride_hor * buffer_height + extra_padding;
      uint8_t *const temp_buffer = (uint8_t *)malloc(buffer_size);
      if (!temp_buffer) {
        malloc_failed = 1;
        break;
      }
      const InterpKernel *interp_kernel =
          (const InterpKernel *)av1_interp_filter_params_list[filter]
              .filter_ptr;
      scale_plane_4_to_3_general(src->buffers[i], src->strides[is_uv],
                                 dst->buffers[i], dst->strides[is_uv], dst_w,
                                 dst_h, interp_kernel, phase, temp_buffer);
      free(temp_buffer);
    } else {
      assert(dst_w == src_w * 2 && dst_h == src_h * 2);
      // 1 to 2
      uint8_t *const temp_buffer = (uint8_t *)malloc(8 * ((src_y_w + 7) & ~7));
      if (!temp_buffer) {
        malloc_failed = 1;
        break;
      }
      const InterpKernel *interp_kernel =
          (const InterpKernel *)av1_interp_filter_params_list[filter]
              .filter_ptr;
      scale_plane_1_to_2_phase_0(src->buffers[i], src->strides[is_uv],
                                 dst->buffers[i], dst->strides[is_uv], src_w,
                                 src_h, interp_kernel[8], temp_buffer);
      free(temp_buffer);
    }
  }

  if (malloc_failed) {
    av1_resize_and_extend_frame_c(src, dst, filter, phase, num_planes);
  } else {
    aom_extend_frame_borders(dst, num_planes);
  }
}